

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  BBox1f BVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  int iVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  byte bVar57;
  uint uVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  float fVar63;
  undefined4 uVar64;
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar92;
  undefined8 uVar94;
  float fVar123;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar122;
  float fVar124;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar93;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 extraout_var [56];
  float fVar125;
  vint4 bi;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar141;
  float fVar142;
  float fVar156;
  float fVar157;
  vint4 ai;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar158;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar191;
  vint4 ai_2;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar192;
  __m128 a;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  float fVar214;
  float fVar215;
  float fVar226;
  float fVar228;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar227;
  float fVar229;
  undefined1 auVar225 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar281 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar307 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar320;
  float fVar321;
  undefined1 auVar313 [16];
  float fVar322;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar319 [32];
  uint local_658;
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [32];
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_488 [16];
  undefined1 (*local_478) [16];
  Primitive *local_470;
  RTCFilterFunctionNArguments args;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined4 local_3e8;
  undefined4 local_3d8;
  uint mask_stack [4];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar121 [64];
  float fVar193;
  float fVar213;
  undefined1 auVar318 [32];
  
  PVar5 = prim[1];
  uVar56 = (ulong)(byte)PVar5;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  lVar59 = uVar56 * 0x25;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xf + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x11 + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1a + 6)));
  fVar192 = *(float *)(prim + lVar59 + 0x12);
  auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar116 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar257._0_4_ = fVar192 * auVar116._0_4_;
  auVar257._4_4_ = fVar192 * auVar116._4_4_;
  auVar257._8_4_ = fVar192 * auVar116._8_4_;
  auVar257._12_4_ = fVar192 * auVar116._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar178);
  auVar178 = vcvtdq2ps_avx(auVar197);
  auVar197 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar131);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1b + 6)));
  auVar131 = vcvtdq2ps_avx(auVar116);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1c + 6)));
  auVar15 = vcvtdq2ps_avx(auVar116);
  auVar65._4_4_ = auVar257._0_4_;
  auVar65._0_4_ = auVar257._0_4_;
  auVar65._8_4_ = auVar257._0_4_;
  auVar65._12_4_ = auVar257._0_4_;
  auVar116 = vshufps_avx(auVar257,auVar257,0x55);
  auVar22 = vshufps_avx(auVar257,auVar257,0xaa);
  fVar63 = auVar22._0_4_;
  auVar233._0_4_ = fVar63 * auVar19._0_4_;
  fVar93 = auVar22._4_4_;
  auVar233._4_4_ = fVar93 * auVar19._4_4_;
  fVar125 = auVar22._8_4_;
  auVar233._8_4_ = fVar125 * auVar19._8_4_;
  fVar142 = auVar22._12_4_;
  auVar233._12_4_ = fVar142 * auVar19._12_4_;
  auVar258._0_4_ = auVar197._0_4_ * fVar63;
  auVar258._4_4_ = auVar197._4_4_ * fVar93;
  auVar258._8_4_ = auVar197._8_4_ * fVar125;
  auVar258._12_4_ = auVar197._12_4_ * fVar142;
  auVar289._0_4_ = auVar15._0_4_ * fVar63;
  auVar289._4_4_ = auVar15._4_4_ * fVar93;
  auVar289._8_4_ = auVar15._8_4_ * fVar125;
  auVar289._12_4_ = auVar15._12_4_ * fVar142;
  auVar22 = vfmadd231ps_fma(auVar233,auVar116,auVar18);
  auVar260 = vfmadd231ps_fma(auVar258,auVar116,auVar178);
  auVar116 = vfmadd231ps_fma(auVar289,auVar131,auVar116);
  auVar22 = vfmadd231ps_fma(auVar22,auVar65,auVar14);
  auVar260 = vfmadd231ps_fma(auVar260,auVar65,auVar20);
  auVar68 = vfmadd231ps_fma(auVar116,auVar21,auVar65);
  auVar66._8_4_ = 0x7fffffff;
  auVar66._0_8_ = 0x7fffffff7fffffff;
  auVar66._12_4_ = 0x7fffffff;
  auVar116 = vandps_avx(auVar22,auVar66);
  auVar126._8_4_ = 0x219392ef;
  auVar126._0_8_ = 0x219392ef219392ef;
  auVar126._12_4_ = 0x219392ef;
  auVar116 = vcmpps_avx(auVar116,auVar126,1);
  auVar65 = vblendvps_avx(auVar22,auVar126,auVar116);
  auVar116 = vandps_avx(auVar260,auVar66);
  auVar116 = vcmpps_avx(auVar116,auVar126,1);
  auVar67 = vblendvps_avx(auVar260,auVar126,auVar116);
  auVar116 = vandps_avx(auVar68,auVar66);
  auVar116 = vcmpps_avx(auVar116,auVar126,1);
  auVar68 = vblendvps_avx(auVar68,auVar126,auVar116);
  auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar116 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar116 = vsubps_avx(auVar116,*(undefined1 (*) [16])(prim + lVar59 + 6));
  fVar63 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar59 + 0x16)) *
           *(float *)(prim + lVar59 + 0x1a);
  auVar290._0_4_ = auVar116._0_4_ * fVar192;
  auVar290._4_4_ = auVar116._4_4_ * fVar192;
  auVar290._8_4_ = auVar116._8_4_ * fVar192;
  auVar290._12_4_ = auVar116._12_4_ * fVar192;
  auVar116 = vshufps_avx(auVar290,auVar290,0xaa);
  fVar192 = auVar116._0_4_;
  auVar234._0_4_ = fVar192 * auVar19._0_4_;
  fVar93 = auVar116._4_4_;
  auVar234._4_4_ = fVar93 * auVar19._4_4_;
  fVar125 = auVar116._8_4_;
  auVar234._8_4_ = fVar125 * auVar19._8_4_;
  fVar142 = auVar116._12_4_;
  auVar234._12_4_ = fVar142 * auVar19._12_4_;
  auVar162._0_4_ = auVar197._0_4_ * fVar192;
  auVar162._4_4_ = auVar197._4_4_ * fVar93;
  auVar162._8_4_ = auVar197._8_4_ * fVar125;
  auVar162._12_4_ = auVar197._12_4_ * fVar142;
  auVar194._0_4_ = auVar15._0_4_ * fVar192;
  auVar194._4_4_ = auVar15._4_4_ * fVar93;
  auVar194._8_4_ = auVar15._8_4_ * fVar125;
  auVar194._12_4_ = auVar15._12_4_ * fVar142;
  auVar19 = vshufps_avx(auVar290,auVar290,0x55);
  auVar197 = vfmadd231ps_fma(auVar234,auVar19,auVar18);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar116 = vpmovsxwd_avx(auVar116);
  auVar178 = vfmadd231ps_fma(auVar162,auVar19,auVar178);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar131 = vfmadd231ps_fma(auVar194,auVar19,auVar131);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar291._4_4_ = auVar290._0_4_;
  auVar291._0_4_ = auVar290._0_4_;
  auVar291._8_4_ = auVar290._0_4_;
  auVar291._12_4_ = auVar290._0_4_;
  auVar126 = vfmadd231ps_fma(auVar197,auVar291,auVar14);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar56 * 0xd + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar129 = vfmadd231ps_fma(auVar178,auVar291,auVar20);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar56 * 0x12 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar194 = vfmadd231ps_fma(auVar131,auVar291,auVar21);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar56 * 0x16 + 6);
  auVar178 = vpmovsxwd_avx(auVar178);
  auVar259._4_4_ = fVar63;
  auVar259._0_4_ = fVar63;
  auVar259._8_4_ = fVar63;
  auVar259._12_4_ = fVar63;
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar116);
  auVar95 = vfmadd213ps_fma(auVar18,auVar259,auVar116);
  auVar116 = vcvtdq2ps_avx(auVar19);
  auVar18 = vcvtdq2ps_avx(auVar14);
  auVar18 = vsubps_avx(auVar18,auVar116);
  auVar96 = vfmadd213ps_fma(auVar18,auVar259,auVar116);
  auVar116 = vcvtdq2ps_avx(auVar20);
  auVar18 = vcvtdq2ps_avx(auVar178);
  auVar18 = vsubps_avx(auVar18,auVar116);
  auVar20 = vfmadd213ps_fma(auVar18,auVar259,auVar116);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar56 * 0x14 + 6);
  auVar116 = vpmovsxwd_avx(auVar197);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar56 * 0x18 + 6);
  auVar18 = vpmovsxwd_avx(auVar21);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar116);
  auVar178 = vfmadd213ps_fma(auVar18,auVar259,auVar116);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar56 * 0x1d + 6);
  auVar116 = vpmovsxwd_avx(auVar131);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar56 * 0x21 + 6);
  auVar18 = vpmovsxwd_avx(auVar15);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar116);
  auVar197 = vfmadd213ps_fma(auVar18,auVar259,auVar116);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar56 * 0x1f + 6);
  auVar116 = vpmovsxwd_avx(auVar22);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar56 * 0x23 + 6);
  auVar18 = vpmovsxwd_avx(auVar260);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar116);
  auVar21 = vfmadd213ps_fma(auVar18,auVar259,auVar116);
  auVar116 = vrcpps_avx(auVar65);
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = 0x3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar65,auVar116,auVar127);
  auVar18 = vfmadd132ps_fma(auVar18,auVar116,auVar116);
  auVar116 = vrcpps_avx(auVar67);
  auVar19 = vfnmadd213ps_fma(auVar67,auVar116,auVar127);
  auVar19 = vfmadd132ps_fma(auVar19,auVar116,auVar116);
  auVar116 = vrcpps_avx(auVar68);
  auVar14 = vfnmadd213ps_fma(auVar68,auVar116,auVar127);
  auVar14 = vfmadd132ps_fma(auVar14,auVar116,auVar116);
  auVar116 = vsubps_avx(auVar95,auVar126);
  auVar143._0_4_ = auVar18._0_4_ * auVar116._0_4_;
  auVar143._4_4_ = auVar18._4_4_ * auVar116._4_4_;
  auVar143._8_4_ = auVar18._8_4_ * auVar116._8_4_;
  auVar143._12_4_ = auVar18._12_4_ * auVar116._12_4_;
  auVar116 = vsubps_avx(auVar96,auVar126);
  auVar128._0_4_ = auVar18._0_4_ * auVar116._0_4_;
  auVar128._4_4_ = auVar18._4_4_ * auVar116._4_4_;
  auVar128._8_4_ = auVar18._8_4_ * auVar116._8_4_;
  auVar128._12_4_ = auVar18._12_4_ * auVar116._12_4_;
  auVar116 = vsubps_avx(auVar20,auVar129);
  auVar159._0_4_ = auVar19._0_4_ * auVar116._0_4_;
  auVar159._4_4_ = auVar19._4_4_ * auVar116._4_4_;
  auVar159._8_4_ = auVar19._8_4_ * auVar116._8_4_;
  auVar159._12_4_ = auVar19._12_4_ * auVar116._12_4_;
  auVar116 = vsubps_avx(auVar178,auVar129);
  auVar95._0_4_ = auVar19._0_4_ * auVar116._0_4_;
  auVar95._4_4_ = auVar19._4_4_ * auVar116._4_4_;
  auVar95._8_4_ = auVar19._8_4_ * auVar116._8_4_;
  auVar95._12_4_ = auVar19._12_4_ * auVar116._12_4_;
  auVar116 = vsubps_avx(auVar197,auVar194);
  auVar176._0_4_ = auVar14._0_4_ * auVar116._0_4_;
  auVar176._4_4_ = auVar14._4_4_ * auVar116._4_4_;
  auVar176._8_4_ = auVar14._8_4_ * auVar116._8_4_;
  auVar176._12_4_ = auVar14._12_4_ * auVar116._12_4_;
  auVar116 = vsubps_avx(auVar21,auVar194);
  auVar67._0_4_ = auVar14._0_4_ * auVar116._0_4_;
  auVar67._4_4_ = auVar14._4_4_ * auVar116._4_4_;
  auVar67._8_4_ = auVar14._8_4_ * auVar116._8_4_;
  auVar67._12_4_ = auVar14._12_4_ * auVar116._12_4_;
  auVar116 = vpminsd_avx(auVar143,auVar128);
  auVar18 = vpminsd_avx(auVar159,auVar95);
  auVar116 = vmaxps_avx(auVar116,auVar18);
  auVar18 = vpminsd_avx(auVar176,auVar67);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar235._4_4_ = uVar64;
  auVar235._0_4_ = uVar64;
  auVar235._8_4_ = uVar64;
  auVar235._12_4_ = uVar64;
  auVar18 = vmaxps_avx(auVar18,auVar235);
  auVar116 = vmaxps_avx(auVar116,auVar18);
  auVar195._0_4_ = auVar116._0_4_ * 0.99999964;
  auVar195._4_4_ = auVar116._4_4_ * 0.99999964;
  auVar195._8_4_ = auVar116._8_4_ * 0.99999964;
  auVar195._12_4_ = auVar116._12_4_ * 0.99999964;
  auVar116 = vpmaxsd_avx(auVar143,auVar128);
  auVar18 = vpmaxsd_avx(auVar159,auVar95);
  auVar116 = vminps_avx(auVar116,auVar18);
  auVar18 = vpmaxsd_avx(auVar176,auVar67);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar129._4_4_ = uVar64;
  auVar129._0_4_ = uVar64;
  auVar129._8_4_ = uVar64;
  auVar129._12_4_ = uVar64;
  auVar18 = vminps_avx(auVar18,auVar129);
  auVar116 = vminps_avx(auVar116,auVar18);
  auVar68._0_4_ = auVar116._0_4_ * 1.0000004;
  auVar68._4_4_ = auVar116._4_4_ * 1.0000004;
  auVar68._8_4_ = auVar116._8_4_ * 1.0000004;
  auVar68._12_4_ = auVar116._12_4_ * 1.0000004;
  local_658 = CONCAT31(0,PVar5);
  auVar96[4] = PVar5;
  auVar96._0_4_ = local_658;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar5;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar5;
  auVar96._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar96,_DAT_01f4ad30);
  auVar116 = vcmpps_avx(auVar195,auVar68,2);
  auVar116 = vandps_avx(auVar116,auVar18);
  uVar62 = vmovmskps_avx(auVar116);
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_478 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_470 = prim;
LAB_0120d0b8:
  uVar56 = (ulong)uVar62;
  if (uVar56 == 0) {
    return;
  }
  lVar59 = 0;
  for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar55 = *(uint *)(local_470 + 2);
  uVar6 = *(uint *)(local_470 + lVar59 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar55].ptr;
  fVar192 = (pGVar7->time_range).lower;
  fVar192 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar192) / ((pGVar7->time_range).upper - fVar192));
  auVar116 = vroundss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),9);
  auVar116 = vminss_avx(auVar116,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar22 = vmaxss_avx(ZEXT816(0),auVar116);
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar6 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar22._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar61);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar61);
  auVar116 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar56);
  lVar59 = uVar56 + 1;
  auVar18 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar59);
  lVar1 = uVar56 + 2;
  auVar19 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar56 + 3;
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar61);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar61);
  auVar20 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar56);
  auVar178 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar59);
  auVar197 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar21 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  auVar260 = ZEXT816(0) << 0x40;
  auVar245._0_4_ = auVar14._0_4_ * 0.0;
  auVar245._4_4_ = auVar14._4_4_ * 0.0;
  auVar245._8_4_ = auVar14._8_4_ * 0.0;
  auVar245._12_4_ = auVar14._12_4_ * 0.0;
  auVar131 = vfmadd231ps_fma(auVar245,auVar19,auVar260);
  auVar67 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar18,auVar131);
  auVar292._8_4_ = 0x40400000;
  auVar292._0_8_ = 0x4040000040400000;
  auVar292._12_4_ = 0x40400000;
  auVar131 = vfmadd231ps_fma(auVar131,auVar18,auVar292);
  auVar143 = vfnmadd231ps_fma(auVar131,auVar116,auVar292);
  auVar196._0_4_ = auVar21._0_4_ * 0.0;
  auVar196._4_4_ = auVar21._4_4_ * 0.0;
  auVar196._8_4_ = auVar21._8_4_ * 0.0;
  auVar196._12_4_ = auVar21._12_4_ * 0.0;
  auVar15 = vfmadd231ps_fma(auVar196,auVar197,auVar260);
  auVar131 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar178,auVar15);
  auVar236._0_4_ = auVar131._0_4_ + auVar20._0_4_;
  auVar236._4_4_ = auVar131._4_4_ + auVar20._4_4_;
  auVar236._8_4_ = auVar131._8_4_ + auVar20._8_4_;
  auVar236._12_4_ = auVar131._12_4_ + auVar20._12_4_;
  auVar131 = vfmadd231ps_fma(auVar15,auVar178,auVar292);
  auVar15 = vfnmadd231ps_fma(auVar131,auVar20,auVar292);
  auVar68 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar19,auVar14);
  auVar279._0_4_ = auVar14._0_4_ * 3.0;
  auVar279._4_4_ = auVar14._4_4_ * 3.0;
  auVar279._8_4_ = auVar14._8_4_ * 3.0;
  auVar279._12_4_ = auVar14._12_4_ * 3.0;
  auVar19 = vfnmadd231ps_fma(auVar279,auVar292,auVar19);
  auVar19 = vfmadd231ps_fma(auVar19,auVar260,auVar18);
  auVar159 = vfnmadd231ps_fma(auVar19,auVar260,auVar116);
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar197,auVar21);
  auVar19 = vfmadd231ps_fma(auVar19,auVar178,auVar260);
  auVar131 = vfmadd231ps_fma(auVar19,auVar20,auVar260);
  auVar216._0_4_ = auVar21._0_4_ * 3.0;
  auVar216._4_4_ = auVar21._4_4_ * 3.0;
  auVar216._8_4_ = auVar21._8_4_ * 3.0;
  auVar216._12_4_ = auVar21._12_4_ * 3.0;
  auVar19 = vfnmadd231ps_fma(auVar216,auVar292,auVar197);
  auVar19 = vfmadd231ps_fma(auVar19,auVar260,auVar178);
  auVar20 = vfnmadd231ps_fma(auVar19,auVar260,auVar20);
  auVar19 = vshufps_avx(auVar143,auVar143,0xc9);
  auVar14 = vshufps_avx(auVar236,auVar236,0xc9);
  fVar214 = auVar143._0_4_;
  auVar97._0_4_ = fVar214 * auVar14._0_4_;
  fVar226 = auVar143._4_4_;
  auVar97._4_4_ = fVar226 * auVar14._4_4_;
  fVar227 = auVar143._8_4_;
  auVar97._8_4_ = fVar227 * auVar14._8_4_;
  fVar228 = auVar143._12_4_;
  auVar97._12_4_ = fVar228 * auVar14._12_4_;
  auVar96 = vfmsub231ps_fma(auVar97,auVar19,auVar236);
  auVar14 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar98._0_4_ = fVar214 * auVar14._0_4_;
  auVar98._4_4_ = fVar226 * auVar14._4_4_;
  auVar98._8_4_ = fVar227 * auVar14._8_4_;
  auVar98._12_4_ = fVar228 * auVar14._12_4_;
  auVar126 = vfmsub231ps_fma(auVar98,auVar19,auVar15);
  auVar19 = vshufps_avx(auVar159,auVar159,0xc9);
  auVar14 = vshufps_avx(auVar131,auVar131,0xc9);
  fVar229 = auVar159._0_4_;
  auVar99._0_4_ = fVar229 * auVar14._0_4_;
  fVar230 = auVar159._4_4_;
  auVar99._4_4_ = fVar230 * auVar14._4_4_;
  fVar231 = auVar159._8_4_;
  auVar99._8_4_ = fVar231 * auVar14._8_4_;
  fVar232 = auVar159._12_4_;
  auVar99._12_4_ = fVar232 * auVar14._12_4_;
  auVar129 = vfmsub231ps_fma(auVar99,auVar19,auVar131);
  auVar14 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar100._0_4_ = fVar229 * auVar14._0_4_;
  auVar100._4_4_ = fVar230 * auVar14._4_4_;
  auVar100._8_4_ = fVar231 * auVar14._8_4_;
  auVar100._12_4_ = fVar232 * auVar14._12_4_;
  auVar194 = vfmsub231ps_fma(auVar100,auVar19,auVar20);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar61);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar61);
  auVar19 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar59);
  auVar14 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar20 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar12 = *(long *)(lVar9 + 0x38 + lVar61);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar61);
  auVar237._0_4_ = auVar20._0_4_ * 0.0;
  auVar237._4_4_ = auVar20._4_4_ * 0.0;
  auVar237._8_4_ = auVar20._8_4_ * 0.0;
  auVar237._12_4_ = auVar20._12_4_ * 0.0;
  auVar178 = vfmadd231ps_fma(auVar237,auVar14,auVar260);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar19,auVar178);
  auVar197 = vfmadd231ps_fma(auVar178,auVar19,auVar292);
  auVar178 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar56);
  auVar176 = vfnmadd231ps_fma(auVar197,auVar178,auVar292);
  auVar197 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar9 * lVar2);
  auVar304._0_4_ = auVar21._0_4_ * 0.0;
  auVar304._4_4_ = auVar21._4_4_ * 0.0;
  auVar304._8_4_ = auVar21._8_4_ * 0.0;
  auVar304._12_4_ = auVar21._12_4_ * 0.0;
  auVar65 = vfmadd231ps_fma(auVar304,auVar197,auVar260);
  auVar131 = *(undefined1 (*) [16])(lVar12 + lVar59 * lVar9);
  auVar260 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar131,auVar65);
  auVar15 = *(undefined1 (*) [16])(lVar12 + uVar56 * lVar9);
  auVar261._0_4_ = auVar15._0_4_ + auVar260._0_4_;
  auVar261._4_4_ = auVar15._4_4_ + auVar260._4_4_;
  auVar261._8_4_ = auVar15._8_4_ + auVar260._8_4_;
  auVar261._12_4_ = auVar15._12_4_ + auVar260._12_4_;
  auVar260 = vshufps_avx(auVar261,auVar261,0xc9);
  fVar191 = auVar176._0_4_;
  auVar160._0_4_ = fVar191 * auVar260._0_4_;
  fVar193 = auVar176._4_4_;
  auVar160._4_4_ = fVar193 * auVar260._4_4_;
  fVar215 = auVar176._8_4_;
  auVar160._8_4_ = fVar215 * auVar260._8_4_;
  fVar213 = auVar176._12_4_;
  auVar160._12_4_ = fVar213 * auVar260._12_4_;
  auVar260 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar127 = vfmsub231ps_fma(auVar160,auVar260,auVar261);
  auVar65 = vfmadd231ps_fma(auVar65,auVar131,auVar292);
  auVar128 = vfnmadd231ps_fma(auVar65,auVar15,auVar292);
  auVar65 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar161._0_4_ = fVar191 * auVar65._0_4_;
  auVar161._4_4_ = fVar193 * auVar65._4_4_;
  auVar161._8_4_ = fVar215 * auVar65._8_4_;
  auVar161._12_4_ = fVar213 * auVar65._12_4_;
  auVar65 = vfmsub231ps_fma(auVar161,auVar260,auVar128);
  auVar260 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar14,auVar20);
  auVar313._0_4_ = auVar20._0_4_ * 3.0;
  auVar313._4_4_ = auVar20._4_4_ * 3.0;
  auVar313._8_4_ = auVar20._8_4_ * 3.0;
  auVar313._12_4_ = auVar20._12_4_ * 3.0;
  auVar128 = vfnmadd231ps_fma(auVar313,auVar292,auVar14);
  auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar197,auVar21);
  auVar144._0_4_ = auVar21._0_4_ * 3.0;
  auVar144._4_4_ = auVar21._4_4_ * 3.0;
  auVar144._8_4_ = auVar21._8_4_ * 3.0;
  auVar144._12_4_ = auVar21._12_4_ * 3.0;
  auVar20 = vfnmadd231ps_fma(auVar144,auVar292,auVar197);
  auVar162 = ZEXT816(0) << 0x20;
  auVar14 = vfmadd231ps_fma(auVar14,auVar131,auVar162);
  auVar20 = vfmadd231ps_fma(auVar20,auVar162,auVar131);
  auVar197 = vfmadd231ps_fma(auVar14,auVar15,auVar162);
  auVar21 = vfnmadd231ps_fma(auVar20,auVar162,auVar15);
  auVar14 = vfmadd231ps_fma(auVar128,auVar162,auVar19);
  auVar162 = vfnmadd231ps_fma(auVar14,auVar162,auVar178);
  auVar17._12_4_ = 0;
  auVar17._0_12_ = ZEXT812(0);
  auVar14 = vshufps_avx(auVar197,auVar197,0xc9);
  fVar91 = auVar162._0_4_;
  auVar130._0_4_ = fVar91 * auVar14._0_4_;
  fVar320 = auVar162._4_4_;
  auVar130._4_4_ = fVar320 * auVar14._4_4_;
  fVar321 = auVar162._8_4_;
  auVar130._8_4_ = fVar321 * auVar14._8_4_;
  fVar322 = auVar162._12_4_;
  auVar130._12_4_ = fVar322 * auVar14._12_4_;
  auVar14 = vshufps_avx(auVar162,auVar162,0xc9);
  auVar15 = vfmsub231ps_fma(auVar130,auVar14,auVar197);
  auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar69._0_4_ = fVar91 * auVar20._0_4_;
  auVar69._4_4_ = fVar320 * auVar20._4_4_;
  auVar69._8_4_ = fVar321 * auVar20._8_4_;
  auVar69._12_4_ = fVar322 * auVar20._12_4_;
  auVar128 = vfmsub231ps_fma(auVar69,auVar14,auVar21);
  fVar192 = fVar192 - auVar22._0_4_;
  auVar14 = vfmadd231ps_fma(auVar68,auVar17 << 0x20,auVar18);
  auVar20 = vpermilps_avx(auVar96,0xc9);
  auVar18 = vdpps_avx(auVar20,auVar20,0x7f);
  p02.field_0.i[0] = auVar67._0_4_;
  p02.field_0.i[1] = auVar67._4_4_;
  p02.field_0.i[2] = auVar67._8_4_;
  p02.field_0.i[3] = auVar67._12_4_;
  auVar273._0_4_ = auVar116._0_4_ + p02.field_0.v[0];
  auVar273._4_4_ = auVar116._4_4_ + p02.field_0.v[1];
  auVar273._8_4_ = auVar116._8_4_ + p02.field_0.v[2];
  auVar273._12_4_ = auVar116._12_4_ + p02.field_0.v[3];
  auVar21 = vfmadd231ps_fma(auVar14,auVar116,auVar17 << 0x20);
  auVar14 = vpermilps_avx(auVar126,0xc9);
  fVar93 = auVar18._0_4_;
  auVar197 = ZEXT416((uint)fVar93);
  auVar116 = vrsqrtss_avx(auVar197,auVar197);
  fVar63 = auVar116._0_4_;
  auVar116 = vdpps_avx(auVar20,auVar14,0x7f);
  fVar125 = fVar63 * 1.5 - fVar93 * 0.5 * fVar63 * fVar63 * fVar63;
  auVar145._0_4_ = fVar93 * auVar14._0_4_;
  auVar145._4_4_ = fVar93 * auVar14._4_4_;
  auVar145._8_4_ = fVar93 * auVar14._8_4_;
  auVar145._12_4_ = fVar93 * auVar14._12_4_;
  fVar63 = auVar116._0_4_;
  auVar163._0_4_ = fVar63 * auVar20._0_4_;
  auVar163._4_4_ = fVar63 * auVar20._4_4_;
  auVar163._8_4_ = fVar63 * auVar20._8_4_;
  auVar163._12_4_ = fVar63 * auVar20._12_4_;
  auVar14 = vsubps_avx(auVar145,auVar163);
  auVar116 = vrcpss_avx(auVar197,auVar197);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar116,SUB6416(ZEXT464(0x40000000),0));
  fVar63 = auVar116._0_4_ * auVar18._0_4_;
  auVar197 = vpermilps_avx(auVar129,0xc9);
  fVar92 = auVar20._0_4_ * fVar125;
  fVar122 = auVar20._4_4_ * fVar125;
  fVar123 = auVar20._8_4_ * fVar125;
  fVar124 = auVar20._12_4_ * fVar125;
  auVar116 = vdpps_avx(auVar197,auVar197,0x7f);
  fVar93 = auVar116._0_4_;
  auVar131 = ZEXT416((uint)fVar93);
  auVar18 = vrsqrtss_avx(auVar131,auVar131);
  fVar142 = auVar18._0_4_;
  fVar142 = fVar142 * 1.5 - fVar142 * fVar142 * fVar93 * 0.5 * fVar142;
  auVar18 = vpermilps_avx(auVar194,0xc9);
  auVar293._0_4_ = fVar93 * auVar18._0_4_;
  auVar293._4_4_ = fVar93 * auVar18._4_4_;
  auVar293._8_4_ = fVar93 * auVar18._8_4_;
  auVar293._12_4_ = fVar93 * auVar18._12_4_;
  auVar18 = vdpps_avx(auVar197,auVar18,0x7f);
  fVar93 = auVar18._0_4_;
  auVar198._0_4_ = auVar197._0_4_ * fVar93;
  auVar198._4_4_ = auVar197._4_4_ * fVar93;
  auVar198._8_4_ = auVar197._8_4_ * fVar93;
  auVar198._12_4_ = auVar197._12_4_ * fVar93;
  auVar20 = vsubps_avx(auVar293,auVar198);
  auVar18 = vrcpss_avx(auVar131,auVar131);
  auVar116 = vfnmadd213ss_fma(auVar116,auVar18,ZEXT416(0x40000000));
  fVar93 = auVar18._0_4_ * auVar116._0_4_;
  fVar141 = auVar197._0_4_ * fVar142;
  fVar156 = auVar197._4_4_ * fVar142;
  fVar157 = auVar197._8_4_ * fVar142;
  fVar158 = auVar197._12_4_ * fVar142;
  auVar116 = vshufps_avx(auVar143,auVar143,0xff);
  auVar18 = vshufps_avx(auVar273,auVar273,0xff);
  auVar199._0_4_ = auVar18._0_4_ * fVar92;
  auVar199._4_4_ = auVar18._4_4_ * fVar122;
  auVar199._8_4_ = auVar18._8_4_ * fVar123;
  auVar199._12_4_ = auVar18._12_4_ * fVar124;
  auVar70._0_4_ = auVar116._0_4_ * fVar92 + auVar18._0_4_ * fVar125 * fVar63 * auVar14._0_4_;
  auVar70._4_4_ = auVar116._4_4_ * fVar122 + auVar18._4_4_ * fVar125 * fVar63 * auVar14._4_4_;
  auVar70._8_4_ = auVar116._8_4_ * fVar123 + auVar18._8_4_ * fVar125 * fVar63 * auVar14._8_4_;
  auVar70._12_4_ = auVar116._12_4_ * fVar124 + auVar18._12_4_ * fVar125 * fVar63 * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar273,auVar199);
  p01.field_0.v[1] = auVar273._4_4_ + auVar199._4_4_;
  p01.field_0.v[0] = auVar273._0_4_ + auVar199._0_4_;
  p01.field_0.v[2] = auVar273._8_4_ + auVar199._8_4_;
  p01.field_0.v[3] = auVar273._12_4_ + auVar199._12_4_;
  auVar197 = vsubps_avx(auVar143,auVar70);
  auVar116 = vshufps_avx(auVar159,auVar159,0xff);
  auVar18 = vshufps_avx(auVar21,auVar21,0xff);
  auVar177._0_4_ = auVar18._0_4_ * fVar141;
  auVar177._4_4_ = auVar18._4_4_ * fVar156;
  auVar177._8_4_ = auVar18._8_4_ * fVar157;
  auVar177._12_4_ = auVar18._12_4_ * fVar158;
  auVar275._0_4_ = auVar116._0_4_ * fVar141 + auVar18._0_4_ * fVar142 * auVar20._0_4_ * fVar93;
  auVar275._4_4_ = auVar116._4_4_ * fVar156 + auVar18._4_4_ * fVar142 * auVar20._4_4_ * fVar93;
  auVar275._8_4_ = auVar116._8_4_ * fVar157 + auVar18._8_4_ * fVar142 * auVar20._8_4_ * fVar93;
  auVar275._12_4_ = auVar116._12_4_ * fVar158 + auVar18._12_4_ * fVar142 * auVar20._12_4_ * fVar93;
  auVar20 = vsubps_avx(auVar21,auVar177);
  local_648._4_4_ = auVar21._4_4_ + auVar177._4_4_;
  local_648._0_4_ = auVar21._0_4_ + auVar177._0_4_;
  uStack_640._0_4_ = auVar21._8_4_ + auVar177._8_4_;
  uStack_640._4_4_ = auVar21._12_4_ + auVar177._12_4_;
  auVar21 = vsubps_avx(auVar159,auVar275);
  auVar131 = vpermilps_avx(auVar127,0xc9);
  auVar116 = vdpps_avx(auVar131,auVar131,0x7f);
  auVar281._12_4_ = 0;
  auVar281._0_12_ = ZEXT812(0);
  auVar18 = vfmadd231ps_fma(auVar260,auVar281 << 0x20,auVar19);
  local_588 = auVar95._0_4_;
  fStack_584 = auVar95._4_4_;
  fStack_580 = auVar95._8_4_;
  fStack_57c = auVar95._12_4_;
  auVar146._0_4_ = auVar178._0_4_ + local_588;
  auVar146._4_4_ = auVar178._4_4_ + fStack_584;
  auVar146._8_4_ = auVar178._8_4_ + fStack_580;
  auVar146._12_4_ = auVar178._12_4_ + fStack_57c;
  auVar22 = vfmadd231ps_fma(auVar18,auVar178,auVar281 << 0x20);
  fVar63 = auVar116._0_4_;
  auVar178 = ZEXT416((uint)fVar63);
  auVar18 = vrsqrtss_avx(auVar178,auVar178);
  fVar93 = auVar18._0_4_;
  fVar125 = fVar93 * 1.5 - fVar63 * 0.5 * fVar93 * fVar93 * fVar93;
  auVar19 = vpermilps_avx(auVar65,0xc9);
  auVar18 = vdpps_avx(auVar131,auVar19,0x7f);
  auVar164._0_4_ = auVar19._0_4_ * fVar63;
  auVar164._4_4_ = auVar19._4_4_ * fVar63;
  auVar164._8_4_ = auVar19._8_4_ * fVar63;
  auVar164._12_4_ = auVar19._12_4_ * fVar63;
  fVar63 = auVar18._0_4_;
  auVar246._0_4_ = fVar63 * auVar131._0_4_;
  auVar246._4_4_ = fVar63 * auVar131._4_4_;
  auVar246._8_4_ = fVar63 * auVar131._8_4_;
  auVar246._12_4_ = fVar63 * auVar131._12_4_;
  auVar19 = vsubps_avx(auVar164,auVar246);
  auVar18 = vrcpss_avx(auVar178,auVar178);
  auVar116 = vfnmadd213ss_fma(auVar116,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar63 = auVar18._0_4_ * auVar116._0_4_;
  auVar15 = vpermilps_avx(auVar15,0xc9);
  auVar116 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar141 = auVar131._0_4_ * fVar125;
  fVar156 = auVar131._4_4_ * fVar125;
  fVar157 = auVar131._8_4_ * fVar125;
  fVar158 = auVar131._12_4_ * fVar125;
  auVar178 = vpermilps_avx(auVar128,0xc9);
  fVar92 = auVar116._0_4_;
  auVar131 = ZEXT416((uint)fVar92);
  auVar18 = vrsqrtss_avx(auVar131,auVar131);
  fVar93 = auVar18._0_4_;
  auVar18 = vdpps_avx(auVar15,auVar178,0x7f);
  fVar142 = fVar93 * 1.5 - fVar92 * 0.5 * fVar93 * fVar93 * fVar93;
  auVar71._0_4_ = fVar92 * auVar178._0_4_;
  auVar71._4_4_ = fVar92 * auVar178._4_4_;
  auVar71._8_4_ = fVar92 * auVar178._8_4_;
  auVar71._12_4_ = fVar92 * auVar178._12_4_;
  fVar93 = auVar18._0_4_;
  auVar132._0_4_ = auVar15._0_4_ * fVar93;
  auVar132._4_4_ = auVar15._4_4_ * fVar93;
  auVar132._8_4_ = auVar15._8_4_ * fVar93;
  auVar132._12_4_ = auVar15._12_4_ * fVar93;
  auVar178 = vsubps_avx(auVar71,auVar132);
  auVar18 = vrcpss_avx(auVar131,auVar131);
  auVar116 = vfnmadd213ss_fma(auVar116,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar93 = auVar116._0_4_ * auVar18._0_4_;
  fVar92 = auVar15._0_4_ * fVar142;
  fVar122 = auVar15._4_4_ * fVar142;
  fVar123 = auVar15._8_4_ * fVar142;
  fVar124 = auVar15._12_4_ * fVar142;
  auVar116 = vshufps_avx(auVar176,auVar176,0xff);
  auVar18 = vshufps_avx(auVar146,auVar146,0xff);
  auVar179._0_4_ = auVar18._0_4_ * fVar141;
  auVar179._4_4_ = auVar18._4_4_ * fVar156;
  auVar179._8_4_ = auVar18._8_4_ * fVar157;
  auVar179._12_4_ = auVar18._12_4_ * fVar158;
  auVar101._0_4_ = auVar116._0_4_ * fVar141 + auVar18._0_4_ * fVar125 * fVar63 * auVar19._0_4_;
  auVar101._4_4_ = auVar116._4_4_ * fVar156 + auVar18._4_4_ * fVar125 * fVar63 * auVar19._4_4_;
  auVar101._8_4_ = auVar116._8_4_ * fVar157 + auVar18._8_4_ * fVar125 * fVar63 * auVar19._8_4_;
  auVar101._12_4_ = auVar116._12_4_ * fVar158 + auVar18._12_4_ * fVar125 * fVar63 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar146,auVar179);
  auVar131 = vsubps_avx(auVar176,auVar101);
  auVar116 = vshufps_avx(auVar162,auVar162,0xff);
  auVar18 = vshufps_avx(auVar22,auVar22,0xff);
  auVar165._0_4_ = auVar18._0_4_ * fVar92;
  auVar165._4_4_ = auVar18._4_4_ * fVar122;
  auVar165._8_4_ = auVar18._8_4_ * fVar123;
  auVar165._12_4_ = auVar18._12_4_ * fVar124;
  auVar102._0_4_ = auVar116._0_4_ * fVar92 + auVar18._0_4_ * fVar142 * auVar178._0_4_ * fVar93;
  auVar102._4_4_ = auVar116._4_4_ * fVar122 + auVar18._4_4_ * fVar142 * auVar178._4_4_ * fVar93;
  auVar102._8_4_ = auVar116._8_4_ * fVar123 + auVar18._8_4_ * fVar142 * auVar178._8_4_ * fVar93;
  auVar102._12_4_ = auVar116._12_4_ * fVar124 + auVar18._12_4_ * fVar142 * auVar178._12_4_ * fVar93;
  auVar116 = vsubps_avx(auVar22,auVar165);
  auVar72._0_4_ = auVar22._0_4_ + auVar165._0_4_;
  auVar72._4_4_ = auVar22._4_4_ + auVar165._4_4_;
  auVar72._8_4_ = auVar22._8_4_ + auVar165._8_4_;
  auVar72._12_4_ = auVar22._12_4_ + auVar165._12_4_;
  auVar18 = vsubps_avx(auVar162,auVar102);
  local_508._0_4_ = auVar197._0_4_;
  local_508._4_4_ = auVar197._4_4_;
  fStack_500 = auVar197._8_4_;
  fStack_4fc = auVar197._12_4_;
  auVar103._0_4_ = auVar14._0_4_ + (float)local_508._0_4_ * 0.33333334;
  auVar103._4_4_ = auVar14._4_4_ + (float)local_508._4_4_ * 0.33333334;
  auVar103._8_4_ = auVar14._8_4_ + fStack_500 * 0.33333334;
  auVar103._12_4_ = auVar14._12_4_ + fStack_4fc * 0.33333334;
  fVar63 = 1.0 - fVar192;
  auVar238._4_4_ = fVar63;
  auVar238._0_4_ = fVar63;
  auVar238._8_4_ = fVar63;
  auVar238._12_4_ = fVar63;
  auVar274._0_4_ = fVar192 * auVar19._0_4_;
  auVar274._4_4_ = fVar192 * auVar19._4_4_;
  auVar274._8_4_ = fVar192 * auVar19._8_4_;
  auVar274._12_4_ = fVar192 * auVar19._12_4_;
  auVar127 = vfmadd231ps_fma(auVar274,auVar238,auVar14);
  auVar147._0_4_ = fVar192 * (auVar19._0_4_ + auVar131._0_4_ * 0.33333334);
  auVar147._4_4_ = fVar192 * (auVar19._4_4_ + auVar131._4_4_ * 0.33333334);
  auVar147._8_4_ = fVar192 * (auVar19._8_4_ + auVar131._8_4_ * 0.33333334);
  auVar147._12_4_ = fVar192 * (auVar19._12_4_ + auVar131._12_4_ * 0.33333334);
  auVar128 = vfmadd231ps_fma(auVar147,auVar238,auVar103);
  local_528._0_4_ = auVar21._0_4_;
  local_528._4_4_ = auVar21._4_4_;
  uStack_520._0_4_ = auVar21._8_4_;
  uStack_520._4_4_ = auVar21._12_4_;
  auVar104._0_4_ = (float)local_528._0_4_ * 0.33333334;
  auVar104._4_4_ = (float)local_528._4_4_ * 0.33333334;
  auVar104._8_4_ = (float)uStack_520 * 0.33333334;
  auVar104._12_4_ = uStack_520._4_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar20,auVar104);
  auVar305._0_4_ = auVar273._0_4_ + auVar199._0_4_ + (fVar214 + auVar70._0_4_) * 0.33333334;
  auVar305._4_4_ = auVar273._4_4_ + auVar199._4_4_ + (fVar226 + auVar70._4_4_) * 0.33333334;
  auVar305._8_4_ = auVar273._8_4_ + auVar199._8_4_ + (fVar227 + auVar70._8_4_) * 0.33333334;
  auVar305._12_4_ = auVar273._12_4_ + auVar199._12_4_ + (fVar228 + auVar70._12_4_) * 0.33333334;
  auVar280._0_4_ = (fVar229 + auVar275._0_4_) * 0.33333334;
  auVar280._4_4_ = (fVar230 + auVar275._4_4_) * 0.33333334;
  auVar280._8_4_ = (fVar231 + auVar275._8_4_) * 0.33333334;
  auVar280._12_4_ = (fVar232 + auVar275._12_4_) * 0.33333334;
  auVar14 = vsubps_avx(_local_648,auVar280);
  auVar166._0_4_ = auVar18._0_4_ * 0.33333334;
  auVar166._4_4_ = auVar18._4_4_ * 0.33333334;
  auVar166._8_4_ = auVar18._8_4_ * 0.33333334;
  auVar166._12_4_ = auVar18._12_4_ * 0.33333334;
  auVar18 = vsubps_avx(auVar116,auVar166);
  auVar247._0_4_ = (fVar91 + auVar102._0_4_) * 0.33333334;
  auVar247._4_4_ = (fVar320 + auVar102._4_4_) * 0.33333334;
  auVar247._8_4_ = (fVar321 + auVar102._8_4_) * 0.33333334;
  auVar247._12_4_ = (fVar322 + auVar102._12_4_) * 0.33333334;
  auVar178 = vsubps_avx(auVar72,auVar247);
  auVar167._0_4_ = fVar192 * auVar18._0_4_;
  auVar167._4_4_ = fVar192 * auVar18._4_4_;
  auVar167._8_4_ = fVar192 * auVar18._8_4_;
  auVar167._12_4_ = fVar192 * auVar18._12_4_;
  auVar217._0_4_ = fVar192 * auVar116._0_4_;
  auVar217._4_4_ = fVar192 * auVar116._4_4_;
  auVar217._8_4_ = fVar192 * auVar116._8_4_;
  auVar217._12_4_ = fVar192 * auVar116._12_4_;
  auVar143 = vfmadd231ps_fma(auVar167,auVar238,auVar19);
  auVar159 = vfmadd231ps_fma(auVar217,auVar238,auVar20);
  auVar105._0_4_ = fVar192 * (auVar146._0_4_ + auVar179._0_4_);
  auVar105._4_4_ = fVar192 * (auVar146._4_4_ + auVar179._4_4_);
  auVar105._8_4_ = fVar192 * (auVar146._8_4_ + auVar179._8_4_);
  auVar105._12_4_ = fVar192 * (auVar146._12_4_ + auVar179._12_4_);
  auVar133._0_4_ =
       fVar192 * (auVar146._0_4_ + auVar179._0_4_ + (fVar191 + auVar101._0_4_) * 0.33333334);
  auVar133._4_4_ =
       fVar192 * (auVar146._4_4_ + auVar179._4_4_ + (fVar193 + auVar101._4_4_) * 0.33333334);
  auVar133._8_4_ =
       fVar192 * (auVar146._8_4_ + auVar179._8_4_ + (fVar215 + auVar101._8_4_) * 0.33333334);
  auVar133._12_4_ =
       fVar192 * (auVar146._12_4_ + auVar179._12_4_ + (fVar213 + auVar101._12_4_) * 0.33333334);
  auVar180._0_4_ = fVar192 * auVar178._0_4_;
  auVar180._4_4_ = fVar192 * auVar178._4_4_;
  auVar180._8_4_ = fVar192 * auVar178._8_4_;
  auVar180._12_4_ = fVar192 * auVar178._12_4_;
  auVar149._0_4_ = fVar192 * auVar72._0_4_;
  auVar149._4_4_ = fVar192 * auVar72._4_4_;
  auVar149._8_4_ = fVar192 * auVar72._8_4_;
  auVar149._12_4_ = fVar192 * auVar72._12_4_;
  auVar176 = vfmadd231ps_fma(auVar105,auVar238,(undefined1  [16])p01.field_0);
  auVar162 = vfmadd231ps_fma(auVar133,auVar238,auVar305);
  auVar233 = vfmadd231ps_fma(auVar180,auVar238,auVar14);
  auVar234 = vfmadd231ps_fma(auVar149,auVar238,_local_648);
  auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar116 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar21 = vsubps_avx(auVar127,auVar116);
  auVar18 = vshufps_avx(auVar21,auVar21,0x55);
  auVar19 = vshufps_avx(auVar21,auVar21,0xaa);
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar192 = pre->ray_space[k].vz.field_0.m128[0];
  fVar63 = pre->ray_space[k].vz.field_0.m128[1];
  fVar93 = pre->ray_space[k].vz.field_0.m128[2];
  fVar125 = pre->ray_space[k].vz.field_0.m128[3];
  auVar73._0_4_ = fVar192 * auVar19._0_4_;
  auVar73._4_4_ = fVar63 * auVar19._4_4_;
  auVar73._8_4_ = fVar93 * auVar19._8_4_;
  auVar73._12_4_ = fVar125 * auVar19._12_4_;
  auVar14 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar18);
  auVar131 = vsubps_avx(auVar128,auVar116);
  auVar18 = vshufps_avx(auVar131,auVar131,0x55);
  auVar19 = vshufps_avx(auVar131,auVar131,0xaa);
  auVar314._0_4_ = fVar192 * auVar19._0_4_;
  auVar314._4_4_ = fVar63 * auVar19._4_4_;
  auVar314._8_4_ = fVar93 * auVar19._8_4_;
  auVar314._12_4_ = fVar125 * auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar314,(undefined1  [16])aVar4,auVar18);
  auVar15 = vsubps_avx(auVar143,auVar116);
  auVar18 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar294._0_4_ = fVar192 * auVar18._0_4_;
  auVar294._4_4_ = fVar63 * auVar18._4_4_;
  auVar294._8_4_ = fVar93 * auVar18._8_4_;
  auVar294._12_4_ = fVar125 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar15,auVar15,0x55);
  auVar20 = vfmadd231ps_fma(auVar294,(undefined1  [16])aVar4,auVar18);
  auVar22 = vsubps_avx(auVar159,auVar116);
  auVar18 = vshufps_avx(auVar22,auVar22,0xaa);
  auVar306._0_4_ = fVar192 * auVar18._0_4_;
  auVar306._4_4_ = fVar63 * auVar18._4_4_;
  auVar306._8_4_ = fVar93 * auVar18._8_4_;
  auVar306._12_4_ = fVar125 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar22,auVar22,0x55);
  auVar178 = vfmadd231ps_fma(auVar306,(undefined1  [16])aVar4,auVar18);
  auVar260 = vsubps_avx(auVar176,auVar116);
  auVar18 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar168._0_4_ = fVar192 * auVar18._0_4_;
  auVar168._4_4_ = fVar63 * auVar18._4_4_;
  auVar168._8_4_ = fVar93 * auVar18._8_4_;
  auVar168._12_4_ = fVar125 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar260,auVar260,0x55);
  auVar197 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar4,auVar18);
  auVar65 = vsubps_avx(auVar162,auVar116);
  auVar18 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar218._0_4_ = fVar192 * auVar18._0_4_;
  auVar218._4_4_ = fVar63 * auVar18._4_4_;
  auVar218._8_4_ = fVar93 * auVar18._8_4_;
  auVar218._12_4_ = fVar125 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar65,auVar65,0x55);
  auVar95 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar4,auVar18);
  auVar67 = vsubps_avx(auVar233,auVar116);
  auVar18 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar248._0_4_ = fVar192 * auVar18._0_4_;
  auVar248._4_4_ = fVar63 * auVar18._4_4_;
  auVar248._8_4_ = fVar93 * auVar18._8_4_;
  auVar248._12_4_ = fVar125 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar67,auVar67,0x55);
  auVar18 = vfmadd231ps_fma(auVar248,(undefined1  [16])aVar4,auVar18);
  auVar68 = vsubps_avx(auVar234,auVar116);
  auVar116 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar181._0_4_ = fVar192 * auVar116._0_4_;
  auVar181._4_4_ = fVar63 * auVar116._4_4_;
  auVar181._8_4_ = fVar93 * auVar116._8_4_;
  auVar181._12_4_ = fVar125 * auVar116._12_4_;
  auVar116 = vshufps_avx(auVar68,auVar68,0x55);
  auVar116 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar4,auVar116);
  local_3d8 = auVar21._0_4_;
  auVar200._4_4_ = local_3d8;
  auVar200._0_4_ = local_3d8;
  auVar200._8_4_ = local_3d8;
  auVar200._12_4_ = local_3d8;
  aVar4 = pre->ray_space[k].vx.field_0;
  auVar96 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar4,auVar200);
  local_3e8 = auVar131._0_4_;
  auVar201._4_4_ = local_3e8;
  auVar201._0_4_ = local_3e8;
  auVar201._8_4_ = local_3e8;
  auVar201._12_4_ = local_3e8;
  auVar126 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar4,auVar201);
  uVar64 = auVar15._0_4_;
  auVar202._4_4_ = uVar64;
  auVar202._0_4_ = uVar64;
  auVar202._8_4_ = uVar64;
  auVar202._12_4_ = uVar64;
  auVar129 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar4,auVar202);
  uVar64 = auVar22._0_4_;
  auVar203._4_4_ = uVar64;
  auVar203._0_4_ = uVar64;
  auVar203._8_4_ = uVar64;
  auVar203._12_4_ = uVar64;
  auVar194 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar4,auVar203);
  uVar64 = auVar260._0_4_;
  auVar204._4_4_ = uVar64;
  auVar204._0_4_ = uVar64;
  auVar204._8_4_ = uVar64;
  auVar204._12_4_ = uVar64;
  auVar235 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar4,auVar204);
  uVar64 = auVar65._0_4_;
  auVar205._4_4_ = uVar64;
  auVar205._0_4_ = uVar64;
  auVar205._8_4_ = uVar64;
  auVar205._12_4_ = uVar64;
  auVar257 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar205);
  uVar64 = auVar67._0_4_;
  auVar206._4_4_ = uVar64;
  auVar206._0_4_ = uVar64;
  auVar206._8_4_ = uVar64;
  auVar206._12_4_ = uVar64;
  auVar258 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar4,auVar206);
  uVar64 = auVar68._0_4_;
  auVar207._4_4_ = uVar64;
  auVar207._0_4_ = uVar64;
  auVar207._8_4_ = uVar64;
  auVar207._12_4_ = uVar64;
  auVar259 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar4,auVar207);
  auVar14 = vmovlhps_avx(auVar96,auVar235);
  auVar20 = vmovlhps_avx(auVar126,auVar257);
  auVar178 = vmovlhps_avx(auVar129,auVar258);
  auVar197 = vmovlhps_avx(auVar194,auVar259);
  auVar116 = vminps_avx(auVar14,auVar20);
  auVar18 = vminps_avx(auVar178,auVar197);
  auVar19 = vminps_avx(auVar116,auVar18);
  auVar116 = vmaxps_avx(auVar14,auVar20);
  auVar18 = vmaxps_avx(auVar178,auVar197);
  auVar116 = vmaxps_avx(auVar116,auVar18);
  auVar18 = vshufpd_avx(auVar19,auVar19,3);
  auVar19 = vminps_avx(auVar19,auVar18);
  auVar18 = vshufpd_avx(auVar116,auVar116,3);
  auVar18 = vmaxps_avx(auVar116,auVar18);
  auVar116 = vandps_avx(auVar66,auVar19);
  auVar18 = vandps_avx(auVar18,auVar66);
  auVar116 = vmaxps_avx(auVar116,auVar18);
  auVar18 = vmovshdup_avx(auVar116);
  auVar116 = vmaxss_avx(auVar18,auVar116);
  fVar63 = auVar116._0_4_ * 9.536743e-07;
  auVar239._8_8_ = auVar96._0_8_;
  auVar239._0_8_ = auVar96._0_8_;
  auVar262._8_8_ = auVar126._0_8_;
  auVar262._0_8_ = auVar126._0_8_;
  auVar295._0_8_ = auVar129._0_8_;
  auVar295._8_8_ = auVar295._0_8_;
  auVar307._0_8_ = auVar194._0_8_;
  auVar307._8_8_ = auVar307._0_8_;
  local_78 = fVar63;
  fStack_74 = fVar63;
  fStack_70 = fVar63;
  fStack_6c = fVar63;
  fStack_68 = fVar63;
  fStack_64 = fVar63;
  fStack_60 = fVar63;
  fStack_5c = fVar63;
  fStack_90 = -fVar63;
  local_98 = -fVar63;
  fStack_94 = -fVar63;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar56 = 0;
  fVar192 = *(float *)(ray + k * 4 + 0x30);
  auVar18 = vsubps_avx(auVar20,auVar14);
  auVar19 = vsubps_avx(auVar178,auVar20);
  auVar95 = vsubps_avx(auVar197,auVar178);
  auVar96 = vsubps_avx(auVar176,auVar127);
  auVar126 = vsubps_avx(auVar162,auVar128);
  auVar129 = vsubps_avx(auVar233,auVar143);
  auVar194 = vsubps_avx(auVar234,auVar159);
  auVar74 = ZEXT816(0x3f80000000000000);
  auVar116 = auVar74;
LAB_0120dce9:
  auVar289 = vshufps_avx(auVar74,auVar74,0x50);
  auVar315._8_4_ = 0x3f800000;
  auVar315._0_8_ = 0x3f8000003f800000;
  auVar315._12_4_ = 0x3f800000;
  auVar318._16_4_ = 0x3f800000;
  auVar318._0_16_ = auVar315;
  auVar318._20_4_ = 0x3f800000;
  auVar318._24_4_ = 0x3f800000;
  auVar318._28_4_ = 0x3f800000;
  auVar290 = vsubps_avx(auVar315,auVar289);
  fVar93 = auVar289._0_4_;
  fVar156 = auVar235._0_4_;
  auVar75._0_4_ = fVar156 * fVar93;
  fVar125 = auVar289._4_4_;
  fVar157 = auVar235._4_4_;
  auVar75._4_4_ = fVar157 * fVar125;
  fVar142 = auVar289._8_4_;
  auVar75._8_4_ = fVar156 * fVar142;
  fVar92 = auVar289._12_4_;
  auVar75._12_4_ = fVar157 * fVar92;
  fVar193 = auVar257._0_4_;
  auVar208._0_4_ = fVar193 * fVar93;
  fVar213 = auVar257._4_4_;
  auVar208._4_4_ = fVar213 * fVar125;
  auVar208._8_4_ = fVar193 * fVar142;
  auVar208._12_4_ = fVar213 * fVar92;
  fVar214 = auVar258._0_4_;
  auVar169._0_4_ = fVar214 * fVar93;
  fVar226 = auVar258._4_4_;
  auVar169._4_4_ = fVar226 * fVar125;
  auVar169._8_4_ = fVar214 * fVar142;
  auVar169._12_4_ = fVar226 * fVar92;
  fVar158 = auVar259._0_4_;
  auVar134._0_4_ = fVar158 * fVar93;
  fVar191 = auVar259._4_4_;
  auVar134._4_4_ = fVar191 * fVar125;
  auVar134._8_4_ = fVar158 * fVar142;
  auVar134._12_4_ = fVar191 * fVar92;
  auVar281 = vfmadd231ps_fma(auVar75,auVar290,auVar239);
  auVar69 = vfmadd231ps_fma(auVar208,auVar290,auVar262);
  auVar70 = vfmadd231ps_fma(auVar169,auVar290,auVar295);
  auVar275 = vfmadd231ps_fma(auVar134,auVar307,auVar290);
  auVar289 = vmovshdup_avx(auVar116);
  fVar93 = auVar116._0_4_;
  fStack_140 = (auVar289._0_4_ - fVar93) * 0.04761905;
  auVar256._4_4_ = fVar93;
  auVar256._0_4_ = fVar93;
  auVar256._8_4_ = fVar93;
  auVar256._12_4_ = fVar93;
  auVar256._16_4_ = fVar93;
  auVar256._20_4_ = fVar93;
  auVar256._24_4_ = fVar93;
  auVar256._28_4_ = fVar93;
  auVar117._0_8_ = auVar289._0_8_;
  auVar117._8_8_ = auVar117._0_8_;
  auVar117._16_8_ = auVar117._0_8_;
  auVar117._24_8_ = auVar117._0_8_;
  auVar88 = vsubps_avx(auVar117,auVar256);
  uVar64 = auVar281._0_4_;
  auVar311._4_4_ = uVar64;
  auVar311._0_4_ = uVar64;
  auVar311._8_4_ = uVar64;
  auVar311._12_4_ = uVar64;
  auVar311._16_4_ = uVar64;
  auVar311._20_4_ = uVar64;
  auVar311._24_4_ = uVar64;
  auVar311._28_4_ = uVar64;
  auVar289 = vmovshdup_avx(auVar281);
  uVar94 = auVar289._0_8_;
  auVar303._8_8_ = uVar94;
  auVar303._0_8_ = uVar94;
  auVar303._16_8_ = uVar94;
  auVar303._24_8_ = uVar94;
  fVar215 = auVar69._0_4_;
  auVar286._4_4_ = fVar215;
  auVar286._0_4_ = fVar215;
  auVar286._8_4_ = fVar215;
  auVar286._12_4_ = fVar215;
  auVar286._16_4_ = fVar215;
  auVar286._20_4_ = fVar215;
  auVar286._24_4_ = fVar215;
  auVar286._28_4_ = fVar215;
  auVar290 = vmovshdup_avx(auVar69);
  auVar118._0_8_ = auVar290._0_8_;
  auVar118._8_8_ = auVar118._0_8_;
  auVar118._16_8_ = auVar118._0_8_;
  auVar118._24_8_ = auVar118._0_8_;
  fVar141 = auVar70._0_4_;
  auVar223._4_4_ = fVar141;
  auVar223._0_4_ = fVar141;
  auVar223._8_4_ = fVar141;
  auVar223._12_4_ = fVar141;
  auVar223._16_4_ = fVar141;
  auVar223._20_4_ = fVar141;
  auVar223._24_4_ = fVar141;
  auVar223._28_4_ = fVar141;
  auVar291 = vmovshdup_avx(auVar70);
  auVar243._0_8_ = auVar291._0_8_;
  auVar243._8_8_ = auVar243._0_8_;
  auVar243._16_8_ = auVar243._0_8_;
  auVar243._24_8_ = auVar243._0_8_;
  fVar124 = auVar275._0_4_;
  auVar17 = vmovshdup_avx(auVar275);
  auVar71 = vfmadd132ps_fma(auVar88,auVar256,_DAT_01f7b040);
  auVar88 = vsubps_avx(auVar318,ZEXT1632(auVar71));
  fVar93 = auVar71._0_4_;
  fVar125 = auVar71._4_4_;
  auVar23._4_4_ = fVar215 * fVar125;
  auVar23._0_4_ = fVar215 * fVar93;
  fVar142 = auVar71._8_4_;
  auVar23._8_4_ = fVar215 * fVar142;
  fVar92 = auVar71._12_4_;
  auVar23._12_4_ = fVar215 * fVar92;
  auVar23._16_4_ = fVar215 * 0.0;
  auVar23._20_4_ = fVar215 * 0.0;
  auVar23._24_4_ = fVar215 * 0.0;
  auVar23._28_4_ = 0x3f800000;
  auVar71 = vfmadd231ps_fma(auVar23,auVar88,auVar311);
  fVar122 = auVar290._0_4_;
  fVar123 = auVar290._4_4_;
  auVar24._4_4_ = fVar123 * fVar125;
  auVar24._0_4_ = fVar122 * fVar93;
  auVar24._8_4_ = fVar122 * fVar142;
  auVar24._12_4_ = fVar123 * fVar92;
  auVar24._16_4_ = fVar122 * 0.0;
  auVar24._20_4_ = fVar123 * 0.0;
  auVar24._24_4_ = fVar122 * 0.0;
  auVar24._28_4_ = uVar64;
  auVar72 = vfmadd231ps_fma(auVar24,auVar88,auVar303);
  auVar25._4_4_ = fVar141 * fVar125;
  auVar25._0_4_ = fVar141 * fVar93;
  auVar25._8_4_ = fVar141 * fVar142;
  auVar25._12_4_ = fVar141 * fVar92;
  auVar25._16_4_ = fVar141 * 0.0;
  auVar25._20_4_ = fVar141 * 0.0;
  auVar25._24_4_ = fVar141 * 0.0;
  auVar25._28_4_ = auVar289._4_4_;
  auVar149 = vfmadd231ps_fma(auVar25,auVar88,auVar286);
  fVar122 = auVar291._0_4_;
  fVar123 = auVar291._4_4_;
  auVar16._4_4_ = fVar123 * fVar125;
  auVar16._0_4_ = fVar122 * fVar93;
  auVar16._8_4_ = fVar122 * fVar142;
  auVar16._12_4_ = fVar123 * fVar92;
  auVar16._16_4_ = fVar122 * 0.0;
  auVar16._20_4_ = fVar123 * 0.0;
  auVar16._24_4_ = fVar122 * 0.0;
  auVar16._28_4_ = fVar215;
  auVar73 = vfmadd231ps_fma(auVar16,auVar88,auVar118);
  auVar289 = vshufps_avx(auVar281,auVar281,0xaa);
  local_578._8_8_ = auVar289._0_8_;
  local_578._0_8_ = local_578._8_8_;
  local_578._16_8_ = local_578._8_8_;
  local_578._24_8_ = local_578._8_8_;
  auVar290 = vshufps_avx(auVar281,auVar281,0xff);
  uStack_640 = auVar290._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar26._4_4_ = fVar124 * fVar125;
  auVar26._0_4_ = fVar124 * fVar93;
  auVar26._8_4_ = fVar124 * fVar142;
  auVar26._12_4_ = fVar124 * fVar92;
  auVar26._16_4_ = fVar124 * 0.0;
  auVar26._20_4_ = fVar124 * 0.0;
  auVar26._24_4_ = fVar124 * 0.0;
  auVar26._28_4_ = fVar124;
  auVar281 = vfmadd231ps_fma(auVar26,auVar88,auVar223);
  auVar290 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar224._0_8_ = auVar290._0_8_;
  auVar224._8_8_ = auVar224._0_8_;
  auVar224._16_8_ = auVar224._0_8_;
  auVar224._24_8_ = auVar224._0_8_;
  auVar291 = vshufps_avx(auVar69,auVar69,0xff);
  uStack_520 = auVar291._0_8_;
  local_528 = (undefined1  [8])uStack_520;
  uStack_518 = uStack_520;
  uStack_510 = uStack_520;
  fVar122 = auVar17._0_4_;
  fVar123 = auVar17._4_4_;
  auVar27._4_4_ = fVar123 * fVar125;
  auVar27._0_4_ = fVar122 * fVar93;
  auVar27._8_4_ = fVar122 * fVar142;
  auVar27._12_4_ = fVar123 * fVar92;
  auVar27._16_4_ = fVar122 * 0.0;
  auVar27._20_4_ = fVar123 * 0.0;
  auVar27._24_4_ = fVar122 * 0.0;
  auVar27._28_4_ = auVar289._4_4_;
  auVar97 = vfmadd231ps_fma(auVar27,auVar88,auVar243);
  auVar28._28_4_ = fVar123;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar149._12_4_ * fVar92,
                          CONCAT48(auVar149._8_4_ * fVar142,
                                   CONCAT44(auVar149._4_4_ * fVar125,auVar149._0_4_ * fVar93))));
  auVar71 = vfmadd231ps_fma(auVar28,auVar88,ZEXT1632(auVar71));
  fVar122 = auVar291._4_4_;
  auVar29._28_4_ = fVar122;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar73._12_4_ * fVar92,
                          CONCAT48(auVar73._8_4_ * fVar142,
                                   CONCAT44(auVar73._4_4_ * fVar125,auVar73._0_4_ * fVar93))));
  auVar72 = vfmadd231ps_fma(auVar29,auVar88,ZEXT1632(auVar72));
  auVar289 = vshufps_avx(auVar70,auVar70,0xaa);
  uVar94 = auVar289._0_8_;
  auVar212._8_8_ = uVar94;
  auVar212._0_8_ = uVar94;
  auVar212._16_8_ = uVar94;
  auVar212._24_8_ = uVar94;
  auVar17 = vshufps_avx(auVar70,auVar70,0xff);
  uVar94 = auVar17._0_8_;
  auVar319._8_8_ = uVar94;
  auVar319._0_8_ = uVar94;
  auVar319._16_8_ = uVar94;
  auVar319._24_8_ = uVar94;
  auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar281._12_4_ * fVar92,
                                               CONCAT48(auVar281._8_4_ * fVar142,
                                                        CONCAT44(auVar281._4_4_ * fVar125,
                                                                 auVar281._0_4_ * fVar93)))),auVar88
                            ,ZEXT1632(auVar149));
  auVar281 = vshufps_avx(auVar275,auVar275,0xaa);
  auVar69 = vshufps_avx(auVar275,auVar275,0xff);
  auVar275 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar97._12_4_,
                                                CONCAT48(fVar142 * auVar97._8_4_,
                                                         CONCAT44(fVar125 * auVar97._4_4_,
                                                                  fVar93 * auVar97._0_4_)))),auVar88
                             ,ZEXT1632(auVar73));
  auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar70._12_4_,
                                                CONCAT48(fVar142 * auVar70._8_4_,
                                                         CONCAT44(fVar125 * auVar70._4_4_,
                                                                  fVar93 * auVar70._0_4_)))),auVar88
                             ,ZEXT1632(auVar71));
  auVar23 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar71));
  auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar275._12_4_,
                                               CONCAT48(fVar142 * auVar275._8_4_,
                                                        CONCAT44(fVar125 * auVar275._4_4_,
                                                                 fVar93 * auVar275._0_4_)))),auVar88
                            ,ZEXT1632(auVar72));
  auVar24 = vsubps_avx(ZEXT1632(auVar275),ZEXT1632(auVar72));
  fStack_4ec = auVar24._28_4_;
  auVar287._0_4_ = fStack_140 * auVar23._0_4_ * 3.0;
  auVar287._4_4_ = fStack_140 * auVar23._4_4_ * 3.0;
  auVar287._8_4_ = fStack_140 * auVar23._8_4_ * 3.0;
  auVar287._12_4_ = fStack_140 * auVar23._12_4_ * 3.0;
  auVar287._16_4_ = fStack_140 * auVar23._16_4_ * 3.0;
  auVar287._20_4_ = fStack_140 * auVar23._20_4_ * 3.0;
  auVar287._24_4_ = fStack_140 * auVar23._24_4_ * 3.0;
  auVar287._28_4_ = 0;
  local_508._0_4_ = fStack_140 * auVar24._0_4_ * 3.0;
  local_508._4_4_ = fStack_140 * auVar24._4_4_ * 3.0;
  fStack_500 = fStack_140 * auVar24._8_4_ * 3.0;
  fStack_4fc = fStack_140 * auVar24._12_4_ * 3.0;
  fStack_4f8 = fStack_140 * auVar24._16_4_ * 3.0;
  fStack_4f4 = fStack_140 * auVar24._20_4_ * 3.0;
  fStack_4f0 = fStack_140 * auVar24._24_4_ * 3.0;
  fVar123 = auVar290._0_4_;
  fVar124 = auVar290._4_4_;
  auVar30._4_4_ = fVar124 * fVar125;
  auVar30._0_4_ = fVar123 * fVar93;
  auVar30._8_4_ = fVar123 * fVar142;
  auVar30._12_4_ = fVar124 * fVar92;
  auVar30._16_4_ = fVar123 * 0.0;
  auVar30._20_4_ = fVar124 * 0.0;
  auVar30._24_4_ = fVar123 * 0.0;
  auVar30._28_4_ = fStack_4ec;
  auVar290 = vfmadd231ps_fma(auVar30,auVar88,local_578);
  fVar123 = auVar291._0_4_;
  auVar288._4_4_ = fVar122 * fVar125;
  auVar288._0_4_ = fVar123 * fVar93;
  auVar288._8_4_ = fVar123 * fVar142;
  auVar288._12_4_ = fVar122 * fVar92;
  auVar288._16_4_ = fVar123 * 0.0;
  auVar288._20_4_ = fVar122 * 0.0;
  auVar288._24_4_ = fVar123 * 0.0;
  auVar288._28_4_ = 0;
  auVar291 = vfmadd231ps_fma(auVar288,auVar88,_local_648);
  fVar122 = auVar289._0_4_;
  fVar123 = auVar289._4_4_;
  auVar32._4_4_ = fVar123 * fVar125;
  auVar32._0_4_ = fVar122 * fVar93;
  auVar32._8_4_ = fVar122 * fVar142;
  auVar32._12_4_ = fVar123 * fVar92;
  auVar32._16_4_ = fVar122 * 0.0;
  auVar32._20_4_ = fVar123 * 0.0;
  auVar32._24_4_ = fVar122 * 0.0;
  auVar32._28_4_ = auVar23._28_4_;
  auVar289 = vfmadd231ps_fma(auVar32,auVar88,auVar224);
  fVar122 = auVar17._0_4_;
  fVar141 = auVar17._4_4_;
  auVar33._4_4_ = fVar141 * fVar125;
  auVar33._0_4_ = fVar122 * fVar93;
  auVar33._8_4_ = fVar122 * fVar142;
  auVar33._12_4_ = fVar141 * fVar92;
  auVar33._16_4_ = fVar122 * 0.0;
  auVar33._20_4_ = fVar141 * 0.0;
  auVar33._24_4_ = fVar122 * 0.0;
  auVar33._28_4_ = fVar124;
  auVar17 = vfmadd231ps_fma(auVar33,auVar88,_local_528);
  auVar26 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar149));
  fVar122 = auVar281._0_4_;
  fVar123 = auVar281._4_4_;
  auVar34._4_4_ = fVar123 * fVar125;
  auVar34._0_4_ = fVar122 * fVar93;
  auVar34._8_4_ = fVar122 * fVar142;
  auVar34._12_4_ = fVar123 * fVar92;
  auVar34._16_4_ = fVar122 * 0.0;
  auVar34._20_4_ = fVar123 * 0.0;
  auVar34._24_4_ = fVar122 * 0.0;
  auVar34._28_4_ = fVar123;
  auVar281 = vfmadd231ps_fma(auVar34,auVar88,auVar212);
  auVar27 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar70));
  fVar122 = auVar69._0_4_;
  fVar123 = auVar69._4_4_;
  auVar35._4_4_ = fVar123 * fVar125;
  auVar35._0_4_ = fVar122 * fVar93;
  auVar35._8_4_ = fVar122 * fVar142;
  auVar35._12_4_ = fVar123 * fVar92;
  auVar35._16_4_ = fVar122 * 0.0;
  auVar35._20_4_ = fVar123 * 0.0;
  auVar35._24_4_ = fVar122 * 0.0;
  auVar35._28_4_ = fVar123;
  auVar69 = vfmadd231ps_fma(auVar35,auVar88,auVar319);
  auVar36._28_4_ = fVar141;
  auVar36._0_28_ =
       ZEXT1628(CONCAT412(auVar289._12_4_ * fVar92,
                          CONCAT48(auVar289._8_4_ * fVar142,
                                   CONCAT44(auVar289._4_4_ * fVar125,auVar289._0_4_ * fVar93))));
  auVar290 = vfmadd231ps_fma(auVar36,auVar88,ZEXT1632(auVar290));
  auVar291 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar17._12_4_,
                                                CONCAT48(fVar142 * auVar17._8_4_,
                                                         CONCAT44(fVar125 * auVar17._4_4_,
                                                                  fVar93 * auVar17._0_4_)))),auVar88
                             ,ZEXT1632(auVar291));
  auVar119._0_4_ = auVar149._0_4_ + auVar287._0_4_;
  auVar119._4_4_ = auVar149._4_4_ + auVar287._4_4_;
  auVar119._8_4_ = auVar149._8_4_ + auVar287._8_4_;
  auVar119._12_4_ = auVar149._12_4_ + auVar287._12_4_;
  auVar119._16_4_ = auVar287._16_4_ + 0.0;
  auVar119._20_4_ = auVar287._20_4_ + 0.0;
  auVar119._24_4_ = auVar287._24_4_ + 0.0;
  auVar119._28_4_ = 0;
  auVar289 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar281._12_4_ * fVar92,
                                                CONCAT48(auVar281._8_4_ * fVar142,
                                                         CONCAT44(auVar281._4_4_ * fVar125,
                                                                  auVar281._0_4_ * fVar93)))),
                             auVar88,ZEXT1632(auVar289));
  auVar17 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar69._12_4_ * fVar92,
                                               CONCAT48(auVar69._8_4_ * fVar142,
                                                        CONCAT44(auVar69._4_4_ * fVar125,
                                                                 auVar69._0_4_ * fVar93)))),auVar88,
                            ZEXT1632(auVar17));
  auVar281 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar289._12_4_,
                                                CONCAT48(fVar142 * auVar289._8_4_,
                                                         CONCAT44(fVar125 * auVar289._4_4_,
                                                                  fVar93 * auVar289._0_4_)))),
                             auVar88,ZEXT1632(auVar290));
  auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar17._12_4_ * fVar92,
                                               CONCAT48(auVar17._8_4_ * fVar142,
                                                        CONCAT44(auVar17._4_4_ * fVar125,
                                                                 auVar17._0_4_ * fVar93)))),
                            ZEXT1632(auVar291),auVar88);
  auVar88 = vsubps_avx(ZEXT1632(auVar289),ZEXT1632(auVar290));
  auVar23 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar291));
  auVar312._0_4_ = fStack_140 * auVar88._0_4_ * 3.0;
  auVar312._4_4_ = fStack_140 * auVar88._4_4_ * 3.0;
  auVar312._8_4_ = fStack_140 * auVar88._8_4_ * 3.0;
  auVar312._12_4_ = fStack_140 * auVar88._12_4_ * 3.0;
  auVar312._16_4_ = fStack_140 * auVar88._16_4_ * 3.0;
  auVar312._20_4_ = fStack_140 * auVar88._20_4_ * 3.0;
  auVar312._24_4_ = fStack_140 * auVar88._24_4_ * 3.0;
  auVar312._28_4_ = 0;
  local_158 = fStack_140 * auVar23._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar23._4_4_ * 3.0;
  auVar37._4_4_ = fStack_154;
  auVar37._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar23._8_4_ * 3.0;
  auVar37._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar23._12_4_ * 3.0;
  auVar37._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar23._16_4_ * 3.0;
  auVar37._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar23._20_4_ * 3.0;
  auVar37._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar23._24_4_ * 3.0;
  auVar37._24_4_ = fStack_140;
  auVar37._28_4_ = 0x40400000;
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar281));
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar69));
  auVar88 = vsubps_avx(ZEXT1632(auVar281),ZEXT1632(auVar149));
  auVar23 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar70));
  auVar24 = vsubps_avx(auVar28,auVar26);
  fVar215 = auVar88._0_4_ + auVar24._0_4_;
  fVar227 = auVar88._4_4_ + auVar24._4_4_;
  fVar228 = auVar88._8_4_ + auVar24._8_4_;
  fVar229 = auVar88._12_4_ + auVar24._12_4_;
  fVar230 = auVar88._16_4_ + auVar24._16_4_;
  fVar231 = auVar88._20_4_ + auVar24._20_4_;
  fVar232 = auVar88._24_4_ + auVar24._24_4_;
  auVar25 = vsubps_avx(auVar29,auVar27);
  auVar89._0_4_ = auVar23._0_4_ + auVar25._0_4_;
  auVar89._4_4_ = auVar23._4_4_ + auVar25._4_4_;
  auVar89._8_4_ = auVar23._8_4_ + auVar25._8_4_;
  auVar89._12_4_ = auVar23._12_4_ + auVar25._12_4_;
  auVar89._16_4_ = auVar23._16_4_ + auVar25._16_4_;
  auVar89._20_4_ = auVar23._20_4_ + auVar25._20_4_;
  auVar89._24_4_ = auVar23._24_4_ + auVar25._24_4_;
  auVar89._28_4_ = auVar23._28_4_ + auVar25._28_4_;
  local_f8 = ZEXT1632(auVar70);
  fVar93 = auVar70._0_4_;
  local_178 = (float)local_508._0_4_ + fVar93;
  fVar125 = auVar70._4_4_;
  fStack_174 = (float)local_508._4_4_ + fVar125;
  fVar142 = auVar70._8_4_;
  fStack_170 = fStack_500 + fVar142;
  fVar92 = auVar70._12_4_;
  fStack_16c = fStack_4fc + fVar92;
  fStack_168 = fStack_4f8 + 0.0;
  fStack_164 = fStack_4f4 + 0.0;
  fStack_160 = fStack_4f0 + 0.0;
  local_b8 = ZEXT1632(auVar149);
  auVar23 = vsubps_avx(local_b8,auVar287);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar23);
  auVar23 = vsubps_avx(local_f8,_local_508);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar23);
  local_118._0_4_ = auVar281._0_4_ + auVar312._0_4_;
  local_118._4_4_ = auVar281._4_4_ + auVar312._4_4_;
  local_118._8_4_ = auVar281._8_4_ + auVar312._8_4_;
  local_118._12_4_ = auVar281._12_4_ + auVar312._12_4_;
  local_118._16_4_ = auVar312._16_4_ + 0.0;
  local_118._20_4_ = auVar312._20_4_ + 0.0;
  local_118._24_4_ = auVar312._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar288 = ZEXT1632(auVar281);
  auVar23 = vsubps_avx(auVar288,auVar312);
  auVar30 = vpermps_avx2(_DAT_01fb7720,auVar23);
  fVar122 = auVar69._0_4_;
  local_158 = fVar122 + local_158;
  fVar123 = auVar69._4_4_;
  fStack_154 = fVar123 + fStack_154;
  fVar124 = auVar69._8_4_;
  fStack_150 = fVar124 + fStack_150;
  fVar141 = auVar69._12_4_;
  fStack_14c = fVar141 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar23 = vsubps_avx(ZEXT1632(auVar69),auVar37);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar23);
  auVar38._4_4_ = fVar125 * fVar227;
  auVar38._0_4_ = fVar93 * fVar215;
  auVar38._8_4_ = fVar142 * fVar228;
  auVar38._12_4_ = fVar92 * fVar229;
  auVar38._16_4_ = fVar230 * 0.0;
  auVar38._20_4_ = fVar231 * 0.0;
  auVar38._24_4_ = fVar232 * 0.0;
  auVar38._28_4_ = auVar23._28_4_;
  auVar289 = vfnmadd231ps_fma(auVar38,local_b8,auVar89);
  fStack_15c = fStack_4ec + 0.0;
  auVar39._4_4_ = fStack_174 * fVar227;
  auVar39._0_4_ = local_178 * fVar215;
  auVar39._8_4_ = fStack_170 * fVar228;
  auVar39._12_4_ = fStack_16c * fVar229;
  auVar39._16_4_ = fStack_168 * fVar230;
  auVar39._20_4_ = fStack_164 * fVar231;
  auVar39._24_4_ = fStack_160 * fVar232;
  auVar39._28_4_ = 0;
  auVar290 = vfnmadd231ps_fma(auVar39,auVar89,auVar119);
  auVar40._4_4_ = local_198._4_4_ * fVar227;
  auVar40._0_4_ = local_198._0_4_ * fVar215;
  auVar40._8_4_ = local_198._8_4_ * fVar228;
  auVar40._12_4_ = local_198._12_4_ * fVar229;
  auVar40._16_4_ = local_198._16_4_ * fVar230;
  auVar40._20_4_ = local_198._20_4_ * fVar231;
  auVar40._24_4_ = local_198._24_4_ * fVar232;
  auVar40._28_4_ = fStack_4ec + 0.0;
  auVar291 = vfnmadd231ps_fma(auVar40,local_d8,auVar89);
  local_648._0_4_ = auVar27._0_4_;
  local_648._4_4_ = auVar27._4_4_;
  uStack_640._0_4_ = auVar27._8_4_;
  uStack_640._4_4_ = auVar27._12_4_;
  uStack_638._0_4_ = auVar27._16_4_;
  uStack_638._4_4_ = auVar27._20_4_;
  uStack_630._0_4_ = auVar27._24_4_;
  uStack_630._4_4_ = auVar27._28_4_;
  auVar41._4_4_ = (float)local_648._4_4_ * fVar227;
  auVar41._0_4_ = (float)local_648._0_4_ * fVar215;
  auVar41._8_4_ = (float)uStack_640 * fVar228;
  auVar41._12_4_ = uStack_640._4_4_ * fVar229;
  auVar41._16_4_ = (float)uStack_638 * fVar230;
  auVar41._20_4_ = uStack_638._4_4_ * fVar231;
  auVar41._24_4_ = (float)uStack_630 * fVar232;
  auVar41._28_4_ = uStack_630._4_4_;
  auVar17 = vfnmadd231ps_fma(auVar41,auVar26,auVar89);
  auVar244._0_4_ = fVar122 * fVar215;
  auVar244._4_4_ = fVar123 * fVar227;
  auVar244._8_4_ = fVar124 * fVar228;
  auVar244._12_4_ = fVar141 * fVar229;
  auVar244._16_4_ = fVar230 * 0.0;
  auVar244._20_4_ = fVar231 * 0.0;
  auVar244._24_4_ = fVar232 * 0.0;
  auVar244._28_4_ = 0;
  auVar281 = vfnmadd231ps_fma(auVar244,auVar288,auVar89);
  uStack_13c = 0x40400000;
  auVar42._4_4_ = fStack_154 * fVar227;
  auVar42._0_4_ = local_158 * fVar215;
  auVar42._8_4_ = fStack_150 * fVar228;
  auVar42._12_4_ = fStack_14c * fVar229;
  auVar42._16_4_ = fStack_148 * fVar230;
  auVar42._20_4_ = fStack_144 * fVar231;
  auVar42._24_4_ = fStack_140 * fVar232;
  auVar42._28_4_ = auVar26._28_4_;
  auVar70 = vfnmadd231ps_fma(auVar42,local_118,auVar89);
  auVar43._4_4_ = local_138._4_4_ * fVar227;
  auVar43._0_4_ = local_138._0_4_ * fVar215;
  auVar43._8_4_ = local_138._8_4_ * fVar228;
  auVar43._12_4_ = local_138._12_4_ * fVar229;
  auVar43._16_4_ = local_138._16_4_ * fVar230;
  auVar43._20_4_ = local_138._20_4_ * fVar231;
  auVar43._24_4_ = local_138._24_4_ * fVar232;
  auVar43._28_4_ = local_138._28_4_;
  auVar275 = vfnmadd231ps_fma(auVar43,auVar30,auVar89);
  auVar44._4_4_ = auVar29._4_4_ * fVar227;
  auVar44._0_4_ = auVar29._0_4_ * fVar215;
  auVar44._8_4_ = auVar29._8_4_ * fVar228;
  auVar44._12_4_ = auVar29._12_4_ * fVar229;
  auVar44._16_4_ = auVar29._16_4_ * fVar230;
  auVar44._20_4_ = auVar29._20_4_ * fVar231;
  auVar44._24_4_ = auVar29._24_4_ * fVar232;
  auVar44._28_4_ = auVar88._28_4_ + auVar24._28_4_;
  auVar71 = vfnmadd231ps_fma(auVar44,auVar28,auVar89);
  auVar23 = vminps_avx(ZEXT1632(auVar289),ZEXT1632(auVar290));
  auVar88 = vmaxps_avx(ZEXT1632(auVar289),ZEXT1632(auVar290));
  auVar24 = vminps_avx(ZEXT1632(auVar291),ZEXT1632(auVar17));
  auVar24 = vminps_avx(auVar23,auVar24);
  auVar23 = vmaxps_avx(ZEXT1632(auVar291),ZEXT1632(auVar17));
  auVar88 = vmaxps_avx(auVar88,auVar23);
  auVar25 = vminps_avx(ZEXT1632(auVar281),ZEXT1632(auVar70));
  auVar23 = vmaxps_avx(ZEXT1632(auVar281),ZEXT1632(auVar70));
  auVar16 = vminps_avx(ZEXT1632(auVar275),ZEXT1632(auVar71));
  auVar25 = vminps_avx(auVar25,auVar16);
  auVar25 = vminps_avx(auVar24,auVar25);
  auVar24 = vmaxps_avx(ZEXT1632(auVar275),ZEXT1632(auVar71));
  auVar23 = vmaxps_avx(auVar23,auVar24);
  auVar23 = vmaxps_avx(auVar88,auVar23);
  auVar53._4_4_ = fStack_74;
  auVar53._0_4_ = local_78;
  auVar53._8_4_ = fStack_70;
  auVar53._12_4_ = fStack_6c;
  auVar53._16_4_ = fStack_68;
  auVar53._20_4_ = fStack_64;
  auVar53._24_4_ = fStack_60;
  auVar53._28_4_ = fStack_5c;
  auVar88 = vcmpps_avx(auVar25,auVar53,2);
  auVar52._4_4_ = fStack_94;
  auVar52._0_4_ = local_98;
  auVar52._8_4_ = fStack_90;
  auVar52._12_4_ = fStack_8c;
  auVar52._16_4_ = fStack_88;
  auVar52._20_4_ = fStack_84;
  auVar52._24_4_ = fStack_80;
  auVar52._28_4_ = fStack_7c;
  auVar23 = vcmpps_avx(auVar23,auVar52,5);
  auVar88 = vandps_avx(auVar23,auVar88);
  auVar23 = local_1b8 & auVar88;
  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0x7f,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar23 >> 0xbf,0) != '\0') ||
      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0') {
    auVar23 = vsubps_avx(auVar26,local_b8);
    auVar24 = vsubps_avx(auVar28,auVar288);
    fVar227 = auVar23._0_4_ + auVar24._0_4_;
    fVar228 = auVar23._4_4_ + auVar24._4_4_;
    fVar229 = auVar23._8_4_ + auVar24._8_4_;
    fVar230 = auVar23._12_4_ + auVar24._12_4_;
    fVar231 = auVar23._16_4_ + auVar24._16_4_;
    fVar232 = auVar23._20_4_ + auVar24._20_4_;
    fVar91 = auVar23._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(auVar27,local_f8);
    auVar16 = vsubps_avx(auVar29,ZEXT1632(auVar69));
    auVar120._0_4_ = auVar25._0_4_ + auVar16._0_4_;
    auVar120._4_4_ = auVar25._4_4_ + auVar16._4_4_;
    auVar120._8_4_ = auVar25._8_4_ + auVar16._8_4_;
    auVar120._12_4_ = auVar25._12_4_ + auVar16._12_4_;
    auVar120._16_4_ = auVar25._16_4_ + auVar16._16_4_;
    auVar120._20_4_ = auVar25._20_4_ + auVar16._20_4_;
    auVar120._24_4_ = auVar25._24_4_ + auVar16._24_4_;
    fVar215 = auVar16._28_4_;
    auVar120._28_4_ = auVar25._28_4_ + fVar215;
    auVar45._4_4_ = fVar125 * fVar228;
    auVar45._0_4_ = fVar93 * fVar227;
    auVar45._8_4_ = fVar142 * fVar229;
    auVar45._12_4_ = fVar92 * fVar230;
    auVar45._16_4_ = fVar231 * 0.0;
    auVar45._20_4_ = fVar232 * 0.0;
    auVar45._24_4_ = fVar91 * 0.0;
    auVar45._28_4_ = auVar29._28_4_;
    auVar281 = vfnmadd231ps_fma(auVar45,auVar120,local_b8);
    auVar46._4_4_ = fVar228 * fStack_174;
    auVar46._0_4_ = fVar227 * local_178;
    auVar46._8_4_ = fVar229 * fStack_170;
    auVar46._12_4_ = fVar230 * fStack_16c;
    auVar46._16_4_ = fVar231 * fStack_168;
    auVar46._20_4_ = fVar232 * fStack_164;
    auVar46._24_4_ = fVar91 * fStack_160;
    auVar46._28_4_ = 0;
    auVar289 = vfnmadd213ps_fma(auVar119,auVar120,auVar46);
    auVar47._4_4_ = fVar228 * local_198._4_4_;
    auVar47._0_4_ = fVar227 * local_198._0_4_;
    auVar47._8_4_ = fVar229 * local_198._8_4_;
    auVar47._12_4_ = fVar230 * local_198._12_4_;
    auVar47._16_4_ = fVar231 * local_198._16_4_;
    auVar47._20_4_ = fVar232 * local_198._20_4_;
    auVar47._24_4_ = fVar91 * local_198._24_4_;
    auVar47._28_4_ = 0;
    auVar290 = vfnmadd213ps_fma(local_d8,auVar120,auVar47);
    auVar48._4_4_ = (float)local_648._4_4_ * fVar228;
    auVar48._0_4_ = (float)local_648._0_4_ * fVar227;
    auVar48._8_4_ = (float)uStack_640 * fVar229;
    auVar48._12_4_ = uStack_640._4_4_ * fVar230;
    auVar48._16_4_ = (float)uStack_638 * fVar231;
    auVar48._20_4_ = uStack_638._4_4_ * fVar232;
    auVar48._24_4_ = (float)uStack_630 * fVar91;
    auVar48._28_4_ = 0;
    auVar69 = vfnmadd231ps_fma(auVar48,auVar120,auVar26);
    auVar154._0_4_ = fVar122 * fVar227;
    auVar154._4_4_ = fVar123 * fVar228;
    auVar154._8_4_ = fVar124 * fVar229;
    auVar154._12_4_ = fVar141 * fVar230;
    auVar154._16_4_ = fVar231 * 0.0;
    auVar154._20_4_ = fVar232 * 0.0;
    auVar154._24_4_ = fVar91 * 0.0;
    auVar154._28_4_ = 0;
    auVar70 = vfnmadd231ps_fma(auVar154,auVar120,auVar288);
    auVar49._4_4_ = fVar228 * fStack_154;
    auVar49._0_4_ = fVar227 * local_158;
    auVar49._8_4_ = fVar229 * fStack_150;
    auVar49._12_4_ = fVar230 * fStack_14c;
    auVar49._16_4_ = fVar231 * fStack_148;
    auVar49._20_4_ = fVar232 * fStack_144;
    auVar49._24_4_ = fVar91 * fStack_140;
    auVar49._28_4_ = fVar215;
    auVar291 = vfnmadd213ps_fma(local_118,auVar120,auVar49);
    auVar50._4_4_ = fVar228 * local_138._4_4_;
    auVar50._0_4_ = fVar227 * local_138._0_4_;
    auVar50._8_4_ = fVar229 * local_138._8_4_;
    auVar50._12_4_ = fVar230 * local_138._12_4_;
    auVar50._16_4_ = fVar231 * local_138._16_4_;
    auVar50._20_4_ = fVar232 * local_138._20_4_;
    auVar50._24_4_ = fVar91 * local_138._24_4_;
    auVar50._28_4_ = fVar215;
    auVar17 = vfnmadd213ps_fma(auVar30,auVar120,auVar50);
    auVar51._4_4_ = fVar228 * auVar29._4_4_;
    auVar51._0_4_ = fVar227 * auVar29._0_4_;
    auVar51._8_4_ = fVar229 * auVar29._8_4_;
    auVar51._12_4_ = fVar230 * auVar29._12_4_;
    auVar51._16_4_ = fVar231 * auVar29._16_4_;
    auVar51._20_4_ = fVar232 * auVar29._20_4_;
    auVar51._24_4_ = fVar91 * auVar29._24_4_;
    auVar51._28_4_ = auVar23._28_4_ + auVar24._28_4_;
    auVar275 = vfnmadd231ps_fma(auVar51,auVar120,auVar28);
    auVar24 = vminps_avx(ZEXT1632(auVar281),ZEXT1632(auVar289));
    auVar23 = vmaxps_avx(ZEXT1632(auVar281),ZEXT1632(auVar289));
    auVar25 = vminps_avx(ZEXT1632(auVar290),ZEXT1632(auVar69));
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(ZEXT1632(auVar290),ZEXT1632(auVar69));
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar16 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar291));
    auVar24 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar291));
    auVar26 = vminps_avx(ZEXT1632(auVar17),ZEXT1632(auVar275));
    auVar16 = vminps_avx(auVar16,auVar26);
    auVar16 = vminps_avx(auVar25,auVar16);
    auVar25 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar275));
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vcmpps_avx(auVar16,auVar53,2);
    auVar24 = vcmpps_avx(auVar24,auVar52,5);
    auVar23 = vandps_avx(auVar24,auVar23);
    auVar88 = vandps_avx(auVar88,local_1b8);
    auVar24 = auVar88 & auVar23;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar88 = vandps_avx(auVar23,auVar88);
      uVar58 = vmovmskps_avx(auVar88);
      if (uVar58 != 0) {
        mask_stack[uVar56] = uVar58 & 0xff;
        BVar3 = (BBox1f)vmovlps_avx(auVar116);
        cu_stack[uVar56] = BVar3;
        BVar3 = (BBox1f)vmovlps_avx(auVar74);
        cv_stack[uVar56] = BVar3;
        uVar56 = (ulong)((int)uVar56 + 1);
      }
    }
  }
LAB_0120e29c:
  if ((int)uVar56 == 0) {
    uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87._4_4_ = uVar64;
    auVar87._0_4_ = uVar64;
    auVar87._8_4_ = uVar64;
    auVar87._12_4_ = uVar64;
    auVar116 = vcmpps_avx(auVar195,auVar87,2);
    uVar55 = vmovmskps_avx(auVar116);
    uVar62 = uVar62 & uVar62 + 0xf & uVar55;
    goto LAB_0120d0b8;
  }
  uVar54 = (int)uVar56 - 1;
  uVar58 = mask_stack[uVar54];
  fVar93 = cu_stack[uVar54].lower;
  fVar125 = cu_stack[uVar54].upper;
  iVar31 = 0;
  for (uVar60 = (ulong)uVar58; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    iVar31 = iVar31 + 1;
  }
  uVar58 = uVar58 - 1 & uVar58;
  if (uVar58 == 0) {
    uVar56 = (ulong)uVar54;
  }
  auVar74._8_8_ = 0;
  auVar74._0_4_ = cv_stack[uVar54].lower;
  auVar74._4_4_ = cv_stack[uVar54].upper;
  mask_stack[uVar54] = uVar58;
  fVar142 = (float)(iVar31 + 1) * 0.14285715;
  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * (float)iVar31 * 0.14285715)),
                             ZEXT416((uint)fVar93),ZEXT416((uint)(1.0 - (float)iVar31 * 0.14285715))
                            );
  auVar289 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar142)),ZEXT416((uint)fVar93),
                             ZEXT416((uint)(1.0 - fVar142)));
  fVar125 = auVar289._0_4_;
  auVar225._0_4_ = auVar116._0_4_;
  fVar93 = fVar125 - auVar225._0_4_;
  if (fVar93 < 0.16666667) {
    auVar290 = vshufps_avx(auVar74,auVar74,0x50);
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = 0x3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar291 = vsubps_avx(auVar106,auVar290);
    fVar142 = auVar290._0_4_;
    auVar170._0_4_ = fVar142 * fVar156;
    fVar92 = auVar290._4_4_;
    auVar170._4_4_ = fVar92 * fVar157;
    fVar122 = auVar290._8_4_;
    auVar170._8_4_ = fVar122 * fVar156;
    fVar123 = auVar290._12_4_;
    auVar170._12_4_ = fVar123 * fVar157;
    auVar182._0_4_ = fVar142 * fVar193;
    auVar182._4_4_ = fVar92 * fVar213;
    auVar182._8_4_ = fVar122 * fVar193;
    auVar182._12_4_ = fVar123 * fVar213;
    auVar209._0_4_ = fVar142 * fVar214;
    auVar209._4_4_ = fVar92 * fVar226;
    auVar209._8_4_ = fVar122 * fVar214;
    auVar209._12_4_ = fVar123 * fVar226;
    auVar76._0_4_ = fVar142 * fVar158;
    auVar76._4_4_ = fVar92 * fVar191;
    auVar76._8_4_ = fVar122 * fVar158;
    auVar76._12_4_ = fVar123 * fVar191;
    auVar290 = vfmadd231ps_fma(auVar170,auVar291,auVar239);
    auVar17 = vfmadd231ps_fma(auVar182,auVar291,auVar262);
    auVar281 = vfmadd231ps_fma(auVar209,auVar291,auVar295);
    auVar291 = vfmadd231ps_fma(auVar76,auVar291,auVar307);
    auVar155._16_16_ = auVar290;
    auVar155._0_16_ = auVar290;
    auVar175._16_16_ = auVar17;
    auVar175._0_16_ = auVar17;
    auVar190._16_16_ = auVar281;
    auVar190._0_16_ = auVar281;
    auVar225._4_4_ = auVar225._0_4_;
    auVar225._8_4_ = auVar225._0_4_;
    auVar225._12_4_ = auVar225._0_4_;
    auVar225._20_4_ = fVar125;
    auVar225._16_4_ = fVar125;
    auVar225._24_4_ = fVar125;
    auVar225._28_4_ = fVar125;
    auVar88 = vsubps_avx(auVar175,auVar155);
    auVar17 = vfmadd213ps_fma(auVar88,auVar225,auVar155);
    auVar88 = vsubps_avx(auVar190,auVar175);
    auVar69 = vfmadd213ps_fma(auVar88,auVar225,auVar175);
    auVar290 = vsubps_avx(auVar291,auVar281);
    auVar90._16_16_ = auVar290;
    auVar90._0_16_ = auVar290;
    auVar290 = vfmadd213ps_fma(auVar90,auVar225,auVar190);
    auVar88 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar17));
    auVar291 = vfmadd213ps_fma(auVar88,auVar225,ZEXT1632(auVar17));
    auVar88 = vsubps_avx(ZEXT1632(auVar290),ZEXT1632(auVar69));
    auVar290 = vfmadd213ps_fma(auVar88,auVar225,ZEXT1632(auVar69));
    auVar88 = vsubps_avx(ZEXT1632(auVar290),ZEXT1632(auVar291));
    auVar71 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar88,auVar225);
    fVar142 = fVar93 * 0.33333334;
    auVar107._0_8_ =
         CONCAT44(auVar71._4_4_ + fVar142 * auVar88._4_4_ * 3.0,
                  auVar71._0_4_ + fVar142 * auVar88._0_4_ * 3.0);
    auVar107._8_4_ = auVar71._8_4_ + fVar142 * auVar88._8_4_ * 3.0;
    auVar107._12_4_ = auVar71._12_4_ + fVar142 * auVar88._12_4_ * 3.0;
    auVar291 = vshufpd_avx(auVar71,auVar71,3);
    auVar17 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar290 = vsubps_avx(auVar291,auVar71);
    auVar281 = vsubps_avx(auVar17,(undefined1  [16])0x0);
    auVar77._0_4_ = auVar290._0_4_ + auVar281._0_4_;
    auVar77._4_4_ = auVar290._4_4_ + auVar281._4_4_;
    auVar77._8_4_ = auVar290._8_4_ + auVar281._8_4_;
    auVar77._12_4_ = auVar290._12_4_ + auVar281._12_4_;
    auVar290 = vshufps_avx(auVar71,auVar71,0xb1);
    auVar281 = vshufps_avx(auVar107,auVar107,0xb1);
    auVar308._4_4_ = auVar77._0_4_;
    auVar308._0_4_ = auVar77._0_4_;
    auVar308._8_4_ = auVar77._0_4_;
    auVar308._12_4_ = auVar77._0_4_;
    auVar69 = vshufps_avx(auVar77,auVar77,0x55);
    fVar92 = auVar69._0_4_;
    auVar78._0_4_ = fVar92 * auVar290._0_4_;
    fVar122 = auVar69._4_4_;
    auVar78._4_4_ = fVar122 * auVar290._4_4_;
    fVar123 = auVar69._8_4_;
    auVar78._8_4_ = fVar123 * auVar290._8_4_;
    fVar124 = auVar69._12_4_;
    auVar78._12_4_ = fVar124 * auVar290._12_4_;
    auVar183._0_4_ = fVar92 * auVar281._0_4_;
    auVar183._4_4_ = fVar122 * auVar281._4_4_;
    auVar183._8_4_ = fVar123 * auVar281._8_4_;
    auVar183._12_4_ = fVar124 * auVar281._12_4_;
    auVar70 = vfmadd231ps_fma(auVar78,auVar308,auVar71);
    auVar275 = vfmadd231ps_fma(auVar183,auVar308,auVar107);
    auVar281 = vshufps_avx(auVar70,auVar70,0xe8);
    auVar69 = vshufps_avx(auVar275,auVar275,0xe8);
    auVar290 = vcmpps_avx(auVar281,auVar69,1);
    uVar58 = vextractps_avx(auVar290,0);
    auVar72 = auVar275;
    if ((uVar58 & 1) == 0) {
      auVar72 = auVar70;
    }
    auVar148._0_4_ = fVar142 * auVar88._16_4_ * 3.0;
    auVar148._4_4_ = fVar142 * auVar88._20_4_ * 3.0;
    auVar148._8_4_ = fVar142 * auVar88._24_4_ * 3.0;
    auVar148._12_4_ = fVar142 * 0.0;
    auVar98 = vsubps_avx((undefined1  [16])0x0,auVar148);
    auVar149 = vshufps_avx(auVar98,auVar98,0xb1);
    auVar73 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar219._0_4_ = fVar92 * auVar149._0_4_;
    auVar219._4_4_ = fVar122 * auVar149._4_4_;
    auVar219._8_4_ = fVar123 * auVar149._8_4_;
    auVar219._12_4_ = fVar124 * auVar149._12_4_;
    auVar240._0_4_ = auVar73._0_4_ * fVar92;
    auVar240._4_4_ = auVar73._4_4_ * fVar122;
    auVar240._8_4_ = auVar73._8_4_ * fVar123;
    auVar240._12_4_ = auVar73._12_4_ * fVar124;
    auVar99 = vfmadd231ps_fma(auVar219,auVar308,auVar98);
    auVar100 = vfmadd231ps_fma(auVar240,(undefined1  [16])0x0,auVar308);
    auVar73 = vshufps_avx(auVar99,auVar99,0xe8);
    auVar97 = vshufps_avx(auVar100,auVar100,0xe8);
    auVar149 = vcmpps_avx(auVar73,auVar97,1);
    uVar58 = vextractps_avx(auVar149,0);
    auVar101 = auVar100;
    if ((uVar58 & 1) == 0) {
      auVar101 = auVar99;
    }
    auVar72 = vmaxss_avx(auVar101,auVar72);
    auVar281 = vminps_avx(auVar281,auVar69);
    auVar69 = vminps_avx(auVar73,auVar97);
    auVar69 = vminps_avx(auVar281,auVar69);
    auVar290 = vshufps_avx(auVar290,auVar290,0x55);
    auVar290 = vblendps_avx(auVar290,auVar149,2);
    auVar149 = vpslld_avx(auVar290,0x1f);
    auVar290 = vshufpd_avx(auVar275,auVar275,1);
    auVar290 = vinsertps_avx(auVar290,auVar100,0x9c);
    auVar281 = vshufpd_avx(auVar70,auVar70,1);
    auVar281 = vinsertps_avx(auVar281,auVar99,0x9c);
    auVar290 = vblendvps_avx(auVar281,auVar290,auVar149);
    auVar281 = vmovshdup_avx(auVar290);
    auVar290 = vmaxss_avx(auVar281,auVar290);
    fVar123 = auVar69._0_4_;
    auVar281 = vmovshdup_avx(auVar69);
    fVar122 = auVar290._0_4_;
    fVar142 = auVar281._0_4_;
    fVar92 = auVar72._0_4_;
    if (((0.0001 <= fVar123) || (fVar122 <= -0.0001)) && (0.0001 <= fVar142 || fVar122 <= -0.0001))
    goto code_r0x0120e5ab;
    goto LAB_0120e5d1;
  }
  auVar116 = vinsertps_avx(auVar116,auVar289,0x10);
  goto LAB_0120dce9;
code_r0x0120e5ab:
  auVar281 = vcmpps_avx(auVar281,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar70 = vcmpps_avx(auVar69,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar281 = vandps_avx(auVar70,auVar281);
  if (fVar92 <= -0.0001 || (auVar281 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0120e29c;
LAB_0120e5d1:
  auVar70 = vcmpps_avx(auVar69,_DAT_01f45a50,1);
  auVar275 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar281 = vcmpss_avx(auVar72,ZEXT816(0) << 0x20,1);
  auVar108._8_4_ = 0x3f800000;
  auVar108._0_8_ = 0x3f8000003f800000;
  auVar108._12_4_ = 0x3f800000;
  auVar135._8_4_ = 0xbf800000;
  auVar135._0_8_ = 0xbf800000bf800000;
  auVar135._12_4_ = 0xbf800000;
  auVar281 = vblendvps_avx(auVar108,auVar135,auVar281);
  auVar70 = vblendvps_avx(auVar108,auVar135,auVar70);
  fVar141 = auVar70._0_4_;
  fVar124 = auVar281._0_4_;
  auVar281 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar141 == fVar124) && (!NAN(fVar141) && !NAN(fVar124))) {
    auVar281 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar141 == fVar124) && (!NAN(fVar141) && !NAN(fVar124))) {
    auVar275 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar70 = vmovshdup_avx(auVar70);
  fVar215 = auVar70._0_4_;
  if ((fVar141 != fVar215) || (NAN(fVar141) || NAN(fVar215))) {
    if ((fVar142 != fVar123) || (NAN(fVar142) || NAN(fVar123))) {
      auVar150._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
      auVar150._8_4_ = auVar69._8_4_ ^ 0x80000000;
      auVar150._12_4_ = auVar69._12_4_ ^ 0x80000000;
      auVar151._0_4_ = -fVar123 / (fVar142 - fVar123);
      auVar151._4_12_ = auVar150._4_12_;
      auVar69 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar151._0_4_)),auVar151,ZEXT416(0));
      auVar70 = auVar69;
    }
    else {
      auVar69 = ZEXT816(0) << 0x20;
      if ((fVar123 != 0.0) || (auVar70 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar123))) {
        auVar69 = SUB6416(ZEXT464(0x7f800000),0);
        auVar70 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar281 = vminss_avx(auVar281,auVar69);
    auVar275 = vmaxss_avx(auVar70,auVar275);
  }
  auVar290 = vcmpss_avx(auVar290,ZEXT416(0),1);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar136._8_4_ = 0xbf800000;
  auVar136._0_8_ = 0xbf800000bf800000;
  auVar136._12_4_ = 0xbf800000;
  auVar290 = vblendvps_avx(auVar109,auVar136,auVar290);
  fVar142 = auVar290._0_4_;
  if ((fVar124 != fVar142) || (NAN(fVar124) || NAN(fVar142))) {
    if ((fVar122 != fVar92) || (NAN(fVar122) || NAN(fVar92))) {
      auVar79._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
      auVar79._8_4_ = auVar72._8_4_ ^ 0x80000000;
      auVar79._12_4_ = auVar72._12_4_ ^ 0x80000000;
      auVar152._0_4_ = -fVar92 / (fVar122 - fVar92);
      auVar152._4_12_ = auVar79._4_12_;
      auVar290 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar152._0_4_)),auVar152,ZEXT416(0));
      auVar69 = auVar290;
    }
    else {
      auVar290 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar92 != 0.0) || (auVar69 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
        auVar290 = SUB6416(ZEXT464(0xff800000),0);
        auVar69 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar281 = vminss_avx(auVar281,auVar69);
    auVar275 = vmaxss_avx(auVar290,auVar275);
  }
  if ((fVar215 != fVar142) || (NAN(fVar215) || NAN(fVar142))) {
    auVar281 = vminss_avx(auVar281,SUB6416(ZEXT464(0x3f800000),0));
    auVar275 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar275);
  }
  auVar290 = vmaxss_avx(ZEXT816(0) << 0x40,auVar281);
  auVar281 = vminss_avx(auVar275,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar281._0_4_ < auVar290._0_4_) goto LAB_0120e29c;
  auVar290 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar290._0_4_ + -0.1)));
  auVar281 = vminss_avx(ZEXT416((uint)(auVar281._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar171._0_8_ = auVar71._0_8_;
  auVar171._8_8_ = auVar171._0_8_;
  auVar249._8_8_ = auVar107._0_8_;
  auVar249._0_8_ = auVar107._0_8_;
  auVar263._8_8_ = auVar98._0_8_;
  auVar263._0_8_ = auVar98._0_8_;
  auVar69 = vshufpd_avx(auVar107,auVar107,3);
  auVar70 = vshufpd_avx(auVar98,auVar98,3);
  auVar275 = vshufps_avx(auVar290,auVar281,0);
  auVar80._8_4_ = 0x3f800000;
  auVar80._0_8_ = 0x3f8000003f800000;
  auVar80._12_4_ = 0x3f800000;
  auVar71 = vsubps_avx(auVar80,auVar275);
  local_548 = auVar291._0_4_;
  fStack_544 = auVar291._4_4_;
  fStack_540 = auVar291._8_4_;
  fStack_53c = auVar291._12_4_;
  fVar142 = auVar275._0_4_;
  auVar81._0_4_ = fVar142 * local_548;
  fVar92 = auVar275._4_4_;
  auVar81._4_4_ = fVar92 * fStack_544;
  fVar122 = auVar275._8_4_;
  auVar81._8_4_ = fVar122 * fStack_540;
  fVar123 = auVar275._12_4_;
  auVar81._12_4_ = fVar123 * fStack_53c;
  auVar210._0_4_ = fVar142 * auVar69._0_4_;
  auVar210._4_4_ = fVar92 * auVar69._4_4_;
  auVar210._8_4_ = fVar122 * auVar69._8_4_;
  auVar210._12_4_ = fVar123 * auVar69._12_4_;
  auVar220._0_4_ = fVar142 * auVar70._0_4_;
  auVar220._4_4_ = fVar92 * auVar70._4_4_;
  auVar220._8_4_ = fVar122 * auVar70._8_4_;
  auVar220._12_4_ = fVar123 * auVar70._12_4_;
  auVar241._0_4_ = fVar142 * auVar17._0_4_;
  auVar241._4_4_ = fVar92 * auVar17._4_4_;
  auVar241._8_4_ = fVar122 * auVar17._8_4_;
  auVar241._12_4_ = fVar123 * auVar17._12_4_;
  auVar69 = vfmadd231ps_fma(auVar81,auVar71,auVar171);
  auVar70 = vfmadd231ps_fma(auVar210,auVar71,auVar249);
  auVar275 = vfmadd231ps_fma(auVar220,auVar71,auVar263);
  auVar71 = vfmadd231ps_fma(auVar241,auVar71,ZEXT816(0));
  auVar291 = vmovshdup_avx(auVar74);
  auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar291._0_4_ * auVar290._0_4_)),auVar74,
                            ZEXT416((uint)(1.0 - auVar290._0_4_)));
  auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar291._0_4_ * auVar281._0_4_)),auVar74,
                            ZEXT416((uint)(1.0 - auVar281._0_4_)));
  fVar142 = 1.0 / fVar93;
  auVar290 = vsubps_avx(auVar70,auVar69);
  auVar250._0_4_ = auVar290._0_4_ * 3.0;
  auVar250._4_4_ = auVar290._4_4_ * 3.0;
  auVar250._8_4_ = auVar290._8_4_ * 3.0;
  auVar250._12_4_ = auVar290._12_4_ * 3.0;
  auVar290 = vsubps_avx(auVar275,auVar70);
  auVar264._0_4_ = auVar290._0_4_ * 3.0;
  auVar264._4_4_ = auVar290._4_4_ * 3.0;
  auVar264._8_4_ = auVar290._8_4_ * 3.0;
  auVar264._12_4_ = auVar290._12_4_ * 3.0;
  auVar290 = vsubps_avx(auVar71,auVar275);
  auVar276._0_4_ = auVar290._0_4_ * 3.0;
  auVar276._4_4_ = auVar290._4_4_ * 3.0;
  auVar276._8_4_ = auVar290._8_4_ * 3.0;
  auVar276._12_4_ = auVar290._12_4_ * 3.0;
  auVar291 = vminps_avx(auVar264,auVar276);
  auVar290 = vmaxps_avx(auVar264,auVar276);
  auVar291 = vminps_avx(auVar250,auVar291);
  auVar290 = vmaxps_avx(auVar250,auVar290);
  auVar74 = vshufpd_avx(auVar291,auVar291,3);
  auVar17 = vshufpd_avx(auVar290,auVar290,3);
  auVar291 = vminps_avx(auVar291,auVar74);
  auVar290 = vmaxps_avx(auVar290,auVar17);
  auVar265._0_4_ = auVar291._0_4_ * fVar142;
  auVar265._4_4_ = auVar291._4_4_ * fVar142;
  auVar265._8_4_ = auVar291._8_4_ * fVar142;
  auVar265._12_4_ = auVar291._12_4_ * fVar142;
  auVar251._0_4_ = auVar290._0_4_ * fVar142;
  auVar251._4_4_ = auVar290._4_4_ * fVar142;
  auVar251._8_4_ = auVar290._8_4_ * fVar142;
  auVar251._12_4_ = auVar290._12_4_ * fVar142;
  fVar142 = 1.0 / (auVar98._0_4_ - auVar97._0_4_);
  auVar290 = vshufpd_avx(auVar69,auVar69,3);
  auVar291 = vshufpd_avx(auVar70,auVar70,3);
  auVar74 = vshufpd_avx(auVar275,auVar275,3);
  auVar17 = vshufpd_avx(auVar71,auVar71,3);
  auVar290 = vsubps_avx(auVar290,auVar69);
  auVar281 = vsubps_avx(auVar291,auVar70);
  auVar69 = vsubps_avx(auVar74,auVar275);
  auVar17 = vsubps_avx(auVar17,auVar71);
  auVar291 = vminps_avx(auVar290,auVar281);
  auVar290 = vmaxps_avx(auVar290,auVar281);
  auVar74 = vminps_avx(auVar69,auVar17);
  auVar74 = vminps_avx(auVar291,auVar74);
  auVar291 = vmaxps_avx(auVar69,auVar17);
  auVar290 = vmaxps_avx(auVar290,auVar291);
  auVar296._0_4_ = fVar142 * auVar74._0_4_;
  auVar296._4_4_ = fVar142 * auVar74._4_4_;
  auVar296._8_4_ = fVar142 * auVar74._8_4_;
  auVar296._12_4_ = fVar142 * auVar74._12_4_;
  auVar282._0_4_ = fVar142 * auVar290._0_4_;
  auVar282._4_4_ = fVar142 * auVar290._4_4_;
  auVar282._8_4_ = fVar142 * auVar290._8_4_;
  auVar282._12_4_ = fVar142 * auVar290._12_4_;
  auVar17 = vinsertps_avx(auVar116,auVar97,0x10);
  auVar281 = vinsertps_avx(auVar289,auVar98,0x10);
  auVar277._0_4_ = (auVar17._0_4_ + auVar281._0_4_) * 0.5;
  auVar277._4_4_ = (auVar17._4_4_ + auVar281._4_4_) * 0.5;
  auVar277._8_4_ = (auVar17._8_4_ + auVar281._8_4_) * 0.5;
  auVar277._12_4_ = (auVar17._12_4_ + auVar281._12_4_) * 0.5;
  auVar82._4_4_ = auVar277._0_4_;
  auVar82._0_4_ = auVar277._0_4_;
  auVar82._8_4_ = auVar277._0_4_;
  auVar82._12_4_ = auVar277._0_4_;
  auVar290 = vfmadd213ps_fma(auVar18,auVar82,auVar14);
  auVar291 = vfmadd213ps_fma(auVar19,auVar82,auVar20);
  auVar74 = vfmadd213ps_fma(auVar95,auVar82,auVar178);
  auVar289 = vsubps_avx(auVar291,auVar290);
  auVar290 = vfmadd213ps_fma(auVar289,auVar82,auVar290);
  auVar289 = vsubps_avx(auVar74,auVar291);
  auVar289 = vfmadd213ps_fma(auVar289,auVar82,auVar291);
  auVar289 = vsubps_avx(auVar289,auVar290);
  auVar290 = vfmadd231ps_fma(auVar290,auVar289,auVar82);
  auVar83._0_8_ = CONCAT44(auVar289._4_4_ * 3.0,auVar289._0_4_ * 3.0);
  auVar83._8_4_ = auVar289._8_4_ * 3.0;
  auVar83._12_4_ = auVar289._12_4_ * 3.0;
  auVar309._8_8_ = auVar290._0_8_;
  auVar309._0_8_ = auVar290._0_8_;
  auVar289 = vshufpd_avx(auVar290,auVar290,3);
  auVar290 = vshufps_avx(auVar277,auVar277,0x55);
  auVar70 = vsubps_avx(auVar289,auVar309);
  auVar71 = vfmadd231ps_fma(auVar309,auVar290,auVar70);
  auVar316._8_8_ = auVar83._0_8_;
  auVar316._0_8_ = auVar83._0_8_;
  auVar289 = vshufpd_avx(auVar83,auVar83,3);
  auVar289 = vsubps_avx(auVar289,auVar316);
  auVar275 = vfmadd213ps_fma(auVar289,auVar290,auVar316);
  auVar290 = vmovshdup_avx(auVar275);
  auVar317._0_8_ = auVar290._0_8_ ^ 0x8000000080000000;
  auVar317._8_4_ = auVar290._8_4_ ^ 0x80000000;
  auVar317._12_4_ = auVar290._12_4_ ^ 0x80000000;
  auVar291 = vmovshdup_avx(auVar70);
  auVar289 = vunpcklps_avx(auVar291,auVar317);
  auVar74 = vshufps_avx(auVar289,auVar317,4);
  auVar69 = vshufps_avx(auVar277,auVar277,0x54);
  auVar153._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
  auVar153._8_4_ = auVar70._8_4_ ^ 0x80000000;
  auVar153._12_4_ = auVar70._12_4_ ^ 0x80000000;
  auVar289 = vmovlhps_avx(auVar153,auVar275);
  auVar289 = vshufps_avx(auVar289,auVar275,8);
  auVar290 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar290._0_4_)),auVar291,auVar275);
  uVar64 = auVar290._0_4_;
  auVar84._4_4_ = uVar64;
  auVar84._0_4_ = uVar64;
  auVar84._8_4_ = uVar64;
  auVar84._12_4_ = uVar64;
  auVar290 = vdivps_avx(auVar74,auVar84);
  auVar291 = vdivps_avx(auVar289,auVar84);
  fVar122 = auVar71._0_4_;
  fVar142 = auVar290._0_4_;
  auVar289 = vshufps_avx(auVar71,auVar71,0x55);
  fVar92 = auVar291._0_4_;
  auVar85._0_4_ = fVar122 * fVar142 + auVar289._0_4_ * fVar92;
  auVar85._4_4_ = fVar122 * auVar290._4_4_ + auVar289._4_4_ * auVar291._4_4_;
  auVar85._8_4_ = fVar122 * auVar290._8_4_ + auVar289._8_4_ * auVar291._8_4_;
  auVar85._12_4_ = fVar122 * auVar290._12_4_ + auVar289._12_4_ * auVar291._12_4_;
  auVar73 = vsubps_avx(auVar69,auVar85);
  auVar69 = vmovshdup_avx(auVar290);
  auVar289 = vinsertps_avx(auVar265,auVar296,0x1c);
  auVar184._0_4_ = auVar69._0_4_ * auVar289._0_4_;
  auVar184._4_4_ = auVar69._4_4_ * auVar289._4_4_;
  auVar184._8_4_ = auVar69._8_4_ * auVar289._8_4_;
  auVar184._12_4_ = auVar69._12_4_ * auVar289._12_4_;
  auVar74 = vinsertps_avx(auVar251,auVar282,0x1c);
  auVar110._0_4_ = auVar74._0_4_ * auVar69._0_4_;
  auVar110._4_4_ = auVar74._4_4_ * auVar69._4_4_;
  auVar110._8_4_ = auVar74._8_4_ * auVar69._8_4_;
  auVar110._12_4_ = auVar74._12_4_ * auVar69._12_4_;
  auVar71 = vminps_avx(auVar184,auVar110);
  auVar275 = vmaxps_avx(auVar110,auVar184);
  auVar69 = vinsertps_avx(auVar296,auVar265,0x4c);
  auVar72 = vmovshdup_avx(auVar291);
  auVar70 = vinsertps_avx(auVar282,auVar251,0x4c);
  auVar283._0_4_ = auVar72._0_4_ * auVar69._0_4_;
  auVar283._4_4_ = auVar72._4_4_ * auVar69._4_4_;
  auVar283._8_4_ = auVar72._8_4_ * auVar69._8_4_;
  auVar283._12_4_ = auVar72._12_4_ * auVar69._12_4_;
  auVar266._0_4_ = auVar72._0_4_ * auVar70._0_4_;
  auVar266._4_4_ = auVar72._4_4_ * auVar70._4_4_;
  auVar266._8_4_ = auVar72._8_4_ * auVar70._8_4_;
  auVar266._12_4_ = auVar72._12_4_ * auVar70._12_4_;
  auVar72 = vminps_avx(auVar283,auVar266);
  auVar297._0_4_ = auVar71._0_4_ + auVar72._0_4_;
  auVar297._4_4_ = auVar71._4_4_ + auVar72._4_4_;
  auVar297._8_4_ = auVar71._8_4_ + auVar72._8_4_;
  auVar297._12_4_ = auVar71._12_4_ + auVar72._12_4_;
  auVar71 = vmaxps_avx(auVar266,auVar283);
  auVar111._0_4_ = auVar71._0_4_ + auVar275._0_4_;
  auVar111._4_4_ = auVar71._4_4_ + auVar275._4_4_;
  auVar111._8_4_ = auVar71._8_4_ + auVar275._8_4_;
  auVar111._12_4_ = auVar71._12_4_ + auVar275._12_4_;
  auVar267._8_8_ = 0x3f80000000000000;
  auVar267._0_8_ = 0x3f80000000000000;
  auVar275 = vsubps_avx(auVar267,auVar111);
  auVar71 = vsubps_avx(auVar267,auVar297);
  auVar72 = vsubps_avx(auVar17,auVar277);
  auVar149 = vsubps_avx(auVar281,auVar277);
  auVar137._0_4_ = fVar142 * auVar289._0_4_;
  auVar137._4_4_ = fVar142 * auVar289._4_4_;
  auVar137._8_4_ = fVar142 * auVar289._8_4_;
  auVar137._12_4_ = fVar142 * auVar289._12_4_;
  auVar298._0_4_ = fVar142 * auVar74._0_4_;
  auVar298._4_4_ = fVar142 * auVar74._4_4_;
  auVar298._8_4_ = fVar142 * auVar74._8_4_;
  auVar298._12_4_ = fVar142 * auVar74._12_4_;
  auVar74 = vminps_avx(auVar137,auVar298);
  auVar289 = vmaxps_avx(auVar298,auVar137);
  auVar185._0_4_ = fVar92 * auVar69._0_4_;
  auVar185._4_4_ = fVar92 * auVar69._4_4_;
  auVar185._8_4_ = fVar92 * auVar69._8_4_;
  auVar185._12_4_ = fVar92 * auVar69._12_4_;
  auVar252._0_4_ = fVar92 * auVar70._0_4_;
  auVar252._4_4_ = fVar92 * auVar70._4_4_;
  auVar252._8_4_ = fVar92 * auVar70._8_4_;
  auVar252._12_4_ = fVar92 * auVar70._12_4_;
  auVar69 = vminps_avx(auVar185,auVar252);
  auVar299._0_4_ = auVar74._0_4_ + auVar69._0_4_;
  auVar299._4_4_ = auVar74._4_4_ + auVar69._4_4_;
  auVar299._8_4_ = auVar74._8_4_ + auVar69._8_4_;
  auVar299._12_4_ = auVar74._12_4_ + auVar69._12_4_;
  fVar215 = auVar72._0_4_;
  auVar310._0_4_ = fVar215 * auVar275._0_4_;
  fVar227 = auVar72._4_4_;
  auVar310._4_4_ = fVar227 * auVar275._4_4_;
  fVar228 = auVar72._8_4_;
  auVar310._8_4_ = fVar228 * auVar275._8_4_;
  fVar229 = auVar72._12_4_;
  auVar310._12_4_ = fVar229 * auVar275._12_4_;
  auVar74 = vmaxps_avx(auVar252,auVar185);
  auVar253._0_4_ = fVar215 * auVar71._0_4_;
  auVar253._4_4_ = fVar227 * auVar71._4_4_;
  auVar253._8_4_ = fVar228 * auVar71._8_4_;
  auVar253._12_4_ = fVar229 * auVar71._12_4_;
  fVar122 = auVar149._0_4_;
  auVar112._0_4_ = fVar122 * auVar275._0_4_;
  fVar123 = auVar149._4_4_;
  auVar112._4_4_ = fVar123 * auVar275._4_4_;
  fVar124 = auVar149._8_4_;
  auVar112._8_4_ = fVar124 * auVar275._8_4_;
  fVar141 = auVar149._12_4_;
  auVar112._12_4_ = fVar141 * auVar275._12_4_;
  auVar268._0_4_ = fVar122 * auVar71._0_4_;
  auVar268._4_4_ = fVar123 * auVar71._4_4_;
  auVar268._8_4_ = fVar124 * auVar71._8_4_;
  auVar268._12_4_ = fVar141 * auVar71._12_4_;
  auVar138._0_4_ = auVar289._0_4_ + auVar74._0_4_;
  auVar138._4_4_ = auVar289._4_4_ + auVar74._4_4_;
  auVar138._8_4_ = auVar289._8_4_ + auVar74._8_4_;
  auVar138._12_4_ = auVar289._12_4_ + auVar74._12_4_;
  auVar186._8_8_ = 0x3f800000;
  auVar186._0_8_ = 0x3f800000;
  auVar289 = vsubps_avx(auVar186,auVar138);
  auVar74 = vsubps_avx(auVar186,auVar299);
  auVar300._0_4_ = fVar215 * auVar289._0_4_;
  auVar300._4_4_ = fVar227 * auVar289._4_4_;
  auVar300._8_4_ = fVar228 * auVar289._8_4_;
  auVar300._12_4_ = fVar229 * auVar289._12_4_;
  auVar284._0_4_ = fVar215 * auVar74._0_4_;
  auVar284._4_4_ = fVar227 * auVar74._4_4_;
  auVar284._8_4_ = fVar228 * auVar74._8_4_;
  auVar284._12_4_ = fVar229 * auVar74._12_4_;
  auVar139._0_4_ = fVar122 * auVar289._0_4_;
  auVar139._4_4_ = fVar123 * auVar289._4_4_;
  auVar139._8_4_ = fVar124 * auVar289._8_4_;
  auVar139._12_4_ = fVar141 * auVar289._12_4_;
  auVar187._0_4_ = fVar122 * auVar74._0_4_;
  auVar187._4_4_ = fVar123 * auVar74._4_4_;
  auVar187._8_4_ = fVar124 * auVar74._8_4_;
  auVar187._12_4_ = fVar141 * auVar74._12_4_;
  auVar289 = vminps_avx(auVar300,auVar284);
  auVar74 = vminps_avx(auVar139,auVar187);
  auVar289 = vminps_avx(auVar289,auVar74);
  auVar74 = vmaxps_avx(auVar284,auVar300);
  auVar69 = vmaxps_avx(auVar187,auVar139);
  auVar70 = vminps_avx(auVar310,auVar253);
  auVar275 = vminps_avx(auVar112,auVar268);
  auVar70 = vminps_avx(auVar70,auVar275);
  auVar289 = vhaddps_avx(auVar289,auVar70);
  auVar74 = vmaxps_avx(auVar69,auVar74);
  auVar69 = vmaxps_avx(auVar253,auVar310);
  auVar70 = vmaxps_avx(auVar268,auVar112);
  auVar69 = vmaxps_avx(auVar70,auVar69);
  auVar74 = vhaddps_avx(auVar74,auVar69);
  auVar289 = vshufps_avx(auVar289,auVar289,0xe8);
  auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
  auVar269._0_4_ = auVar73._0_4_ + auVar289._0_4_;
  auVar269._4_4_ = auVar73._4_4_ + auVar289._4_4_;
  auVar269._8_4_ = auVar73._8_4_ + auVar289._8_4_;
  auVar269._12_4_ = auVar73._12_4_ + auVar289._12_4_;
  auVar254._0_4_ = auVar73._0_4_ + auVar74._0_4_;
  auVar254._4_4_ = auVar73._4_4_ + auVar74._4_4_;
  auVar254._8_4_ = auVar73._8_4_ + auVar74._8_4_;
  auVar254._12_4_ = auVar73._12_4_ + auVar74._12_4_;
  auVar289 = vmaxps_avx(auVar17,auVar269);
  auVar74 = vminps_avx(auVar254,auVar281);
  auVar289 = vcmpps_avx(auVar74,auVar289,1);
  auVar289 = vshufps_avx(auVar289,auVar289,0x50);
  if ((auVar289 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar289[0xf] < '\0')
  goto LAB_0120e29c;
  bVar57 = 0;
  if ((auVar225._0_4_ < auVar269._0_4_) && (bVar57 = 0, auVar254._0_4_ < auVar281._0_4_)) {
    auVar74 = vmovshdup_avx(auVar269);
    auVar289 = vcmpps_avx(auVar254,auVar281,1);
    bVar57 = auVar289[4] & auVar97._0_4_ < auVar74._0_4_;
  }
  p03.field_0.i[0] = auVar197._0_4_;
  p03.field_0.i[1] = auVar197._4_4_;
  p03.field_0.i[2] = auVar197._8_4_;
  p03.field_0.i[3] = auVar197._12_4_;
  if (((3 < (uint)uVar56 || fVar93 < 0.001) | bVar57) == 1) {
    lVar59 = 0xc9;
    do {
      lVar59 = lVar59 + -1;
      if (lVar59 == 0) goto LAB_0120e29c;
      fVar123 = auVar73._0_4_;
      fVar122 = 1.0 - fVar123;
      fVar93 = fVar122 * fVar122 * fVar122;
      fVar125 = fVar123 * 3.0 * fVar122 * fVar122;
      fVar122 = fVar122 * fVar123 * fVar123 * 3.0;
      auVar172._4_4_ = fVar93;
      auVar172._0_4_ = fVar93;
      auVar172._8_4_ = fVar93;
      auVar172._12_4_ = fVar93;
      auVar140._4_4_ = fVar125;
      auVar140._0_4_ = fVar125;
      auVar140._8_4_ = fVar125;
      auVar140._12_4_ = fVar125;
      auVar113._4_4_ = fVar122;
      auVar113._0_4_ = fVar122;
      auVar113._8_4_ = fVar122;
      auVar113._12_4_ = fVar122;
      fVar123 = fVar123 * fVar123 * fVar123;
      auVar188._0_4_ = p03.field_0.v[0] * fVar123;
      auVar188._4_4_ = p03.field_0.v[1] * fVar123;
      auVar188._8_4_ = p03.field_0.v[2] * fVar123;
      auVar188._12_4_ = p03.field_0.v[3] * fVar123;
      auVar116 = vfmadd231ps_fma(auVar188,auVar178,auVar113);
      auVar116 = vfmadd231ps_fma(auVar116,auVar20,auVar140);
      auVar116 = vfmadd231ps_fma(auVar116,auVar14,auVar172);
      auVar114._8_8_ = auVar116._0_8_;
      auVar114._0_8_ = auVar116._0_8_;
      auVar116 = vshufpd_avx(auVar116,auVar116,3);
      auVar289 = vshufps_avx(auVar73,auVar73,0x55);
      auVar116 = vsubps_avx(auVar116,auVar114);
      auVar289 = vfmadd213ps_fma(auVar116,auVar289,auVar114);
      fVar93 = auVar289._0_4_;
      auVar116 = vshufps_avx(auVar289,auVar289,0x55);
      auVar115._0_4_ = fVar142 * fVar93 + fVar92 * auVar116._0_4_;
      auVar115._4_4_ = auVar290._4_4_ * fVar93 + auVar291._4_4_ * auVar116._4_4_;
      auVar115._8_4_ = auVar290._8_4_ * fVar93 + auVar291._8_4_ * auVar116._8_4_;
      auVar115._12_4_ = auVar290._12_4_ * fVar93 + auVar291._12_4_ * auVar116._12_4_;
      auVar73 = vsubps_avx(auVar73,auVar115);
      auVar116 = vandps_avx(auVar66,auVar289);
      auVar289 = vshufps_avx(auVar116,auVar116,0xf5);
      auVar116 = vmaxss_avx(auVar289,auVar116);
    } while (fVar63 <= auVar116._0_4_);
    local_218 = auVar73._0_4_;
    if ((0.0 <= local_218) && (local_218 <= 1.0)) {
      auVar116 = vmovshdup_avx(auVar73);
      fVar93 = auVar116._0_4_;
      if ((0.0 <= fVar93) && (fVar93 <= 1.0)) {
        auVar116 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar69 = vinsertps_avx(auVar116,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar116 = vdpps_avx(auVar69,auVar21,0x7f);
        auVar289 = vdpps_avx(auVar69,auVar131,0x7f);
        auVar290 = vdpps_avx(auVar69,auVar15,0x7f);
        auVar291 = vdpps_avx(auVar69,auVar22,0x7f);
        auVar74 = vdpps_avx(auVar69,auVar260,0x7f);
        auVar17 = vdpps_avx(auVar69,auVar65,0x7f);
        auVar281 = vdpps_avx(auVar69,auVar67,0x7f);
        auVar69 = vdpps_avx(auVar69,auVar68,0x7f);
        fVar125 = 1.0 - fVar93;
        auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar74._0_4_)),ZEXT416((uint)fVar125),
                                   auVar116);
        auVar289 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * fVar93)),ZEXT416((uint)fVar125),
                                   auVar289);
        auVar290 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ * fVar93)),ZEXT416((uint)fVar125),
                                   auVar290);
        auVar291 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar69._0_4_)),ZEXT416((uint)fVar125),
                                   auVar291);
        fVar122 = 1.0 - local_218;
        fVar125 = fVar122 * local_218 * local_218 * 3.0;
        fVar124 = local_218 * local_218 * local_218;
        auVar290 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * auVar291._0_4_)),ZEXT416((uint)fVar125),
                                   auVar290);
        fVar142 = local_218 * 3.0 * fVar122 * fVar122;
        auVar289 = vfmadd231ss_fma(auVar290,ZEXT416((uint)fVar142),auVar289);
        fVar92 = fVar122 * fVar122 * fVar122;
        auVar116 = vfmadd231ss_fma(auVar289,ZEXT416((uint)fVar92),auVar116);
        fVar123 = auVar116._0_4_;
        if (((fVar192 <= fVar123) && (fVar141 = *(float *)(ray + k * 4 + 0x80), fVar123 <= fVar141))
           && (pGVar7 = (context->scene->geometries).items[uVar55].ptr,
              (pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar116 = vshufps_avx(auVar73,auVar73,0x55);
          auVar255._8_4_ = 0x3f800000;
          auVar255._0_8_ = 0x3f8000003f800000;
          auVar255._12_4_ = 0x3f800000;
          auVar289 = vsubps_avx(auVar255,auVar116);
          local_428 = auVar176._0_4_;
          fStack_424 = auVar176._4_4_;
          fStack_420 = auVar176._8_4_;
          fStack_41c = auVar176._12_4_;
          fVar215 = auVar116._0_4_;
          auVar270._0_4_ = fVar215 * local_428;
          fVar227 = auVar116._4_4_;
          auVar270._4_4_ = fVar227 * fStack_424;
          fVar228 = auVar116._8_4_;
          auVar270._8_4_ = fVar228 * fStack_420;
          fVar229 = auVar116._12_4_;
          auVar270._12_4_ = fVar229 * fStack_41c;
          local_438 = auVar162._0_4_;
          fStack_434 = auVar162._4_4_;
          fStack_430 = auVar162._8_4_;
          fStack_42c = auVar162._12_4_;
          auVar278._0_4_ = fVar215 * local_438;
          auVar278._4_4_ = fVar227 * fStack_434;
          auVar278._8_4_ = fVar228 * fStack_430;
          auVar278._12_4_ = fVar229 * fStack_42c;
          local_4b8 = auVar233._0_4_;
          fStack_4b4 = auVar233._4_4_;
          fStack_4b0 = auVar233._8_4_;
          fStack_4ac = auVar233._12_4_;
          auVar285._0_4_ = fVar215 * local_4b8;
          auVar285._4_4_ = fVar227 * fStack_4b4;
          auVar285._8_4_ = fVar228 * fStack_4b0;
          auVar285._12_4_ = fVar229 * fStack_4ac;
          local_4c8 = auVar234._0_4_;
          fStack_4c4 = auVar234._4_4_;
          fStack_4c0 = auVar234._8_4_;
          fStack_4bc = auVar234._12_4_;
          auVar301._0_4_ = fVar215 * local_4c8;
          auVar301._4_4_ = fVar227 * fStack_4c4;
          auVar301._8_4_ = fVar228 * fStack_4c0;
          auVar301._12_4_ = fVar229 * fStack_4bc;
          auVar290 = vfmadd231ps_fma(auVar270,auVar289,auVar127);
          auVar291 = vfmadd231ps_fma(auVar278,auVar289,auVar128);
          auVar74 = vfmadd231ps_fma(auVar285,auVar289,auVar143);
          auVar17 = vfmadd231ps_fma(auVar301,auVar289,auVar159);
          auVar289 = vsubps_avx(auVar291,auVar290);
          auVar290 = vsubps_avx(auVar74,auVar291);
          auVar291 = vsubps_avx(auVar17,auVar74);
          auVar302._0_4_ = local_218 * auVar290._0_4_;
          auVar302._4_4_ = local_218 * auVar290._4_4_;
          auVar302._8_4_ = local_218 * auVar290._8_4_;
          auVar302._12_4_ = local_218 * auVar290._12_4_;
          auVar242._4_4_ = fVar122;
          auVar242._0_4_ = fVar122;
          auVar242._8_4_ = fVar122;
          auVar242._12_4_ = fVar122;
          auVar289 = vfmadd231ps_fma(auVar302,auVar242,auVar289);
          auVar271._0_4_ = local_218 * auVar291._0_4_;
          auVar271._4_4_ = local_218 * auVar291._4_4_;
          auVar271._8_4_ = local_218 * auVar291._8_4_;
          auVar271._12_4_ = local_218 * auVar291._12_4_;
          auVar290 = vfmadd231ps_fma(auVar271,auVar242,auVar290);
          auVar272._0_4_ = local_218 * auVar290._0_4_;
          auVar272._4_4_ = local_218 * auVar290._4_4_;
          auVar272._8_4_ = local_218 * auVar290._8_4_;
          auVar272._12_4_ = local_218 * auVar290._12_4_;
          auVar290 = vfmadd231ps_fma(auVar272,auVar242,auVar289);
          local_368 = auVar194._0_4_;
          fStack_364 = auVar194._4_4_;
          fStack_360 = auVar194._8_4_;
          fStack_35c = auVar194._12_4_;
          auVar221._0_4_ = fVar124 * local_368;
          auVar221._4_4_ = fVar124 * fStack_364;
          auVar221._8_4_ = fVar124 * fStack_360;
          auVar221._12_4_ = fVar124 * fStack_35c;
          auVar173._4_4_ = fVar125;
          auVar173._0_4_ = fVar125;
          auVar173._8_4_ = fVar125;
          auVar173._12_4_ = fVar125;
          auVar289 = vfmadd132ps_fma(auVar173,auVar221,auVar129);
          auVar211._4_4_ = fVar142;
          auVar211._0_4_ = fVar142;
          auVar211._8_4_ = fVar142;
          auVar211._12_4_ = fVar142;
          auVar289 = vfmadd132ps_fma(auVar211,auVar289,auVar126);
          auVar222._0_4_ = auVar290._0_4_ * 3.0;
          auVar222._4_4_ = auVar290._4_4_ * 3.0;
          auVar222._8_4_ = auVar290._8_4_ * 3.0;
          auVar222._12_4_ = auVar290._12_4_ * 3.0;
          auVar189._4_4_ = fVar92;
          auVar189._0_4_ = fVar92;
          auVar189._8_4_ = fVar92;
          auVar189._12_4_ = fVar92;
          auVar290 = vfmadd132ps_fma(auVar189,auVar289,auVar96);
          auVar289 = vshufps_avx(auVar222,auVar222,0xc9);
          auVar174._0_4_ = auVar290._0_4_ * auVar289._0_4_;
          auVar174._4_4_ = auVar290._4_4_ * auVar289._4_4_;
          auVar174._8_4_ = auVar290._8_4_ * auVar289._8_4_;
          auVar174._12_4_ = auVar290._12_4_ * auVar289._12_4_;
          auVar289 = vshufps_avx(auVar290,auVar290,0xc9);
          auVar289 = vfmsub231ps_fma(auVar174,auVar222,auVar289);
          local_228 = auVar289._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar123;
            uVar64 = vextractps_avx(auVar289,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar64;
            uVar64 = vextractps_avx(auVar289,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar64;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = local_218;
            *(float *)(ray + k * 4 + 0x100) = fVar93;
            *(uint *)(ray + k * 4 + 0x110) = uVar6;
            *(uint *)(ray + k * 4 + 0x120) = uVar55;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar290 = vshufps_avx(auVar289,auVar289,0x55);
            auVar289 = vshufps_avx(auVar289,auVar289,0xaa);
            local_248[0] = (RTCHitN)auVar290[0];
            local_248[1] = (RTCHitN)auVar290[1];
            local_248[2] = (RTCHitN)auVar290[2];
            local_248[3] = (RTCHitN)auVar290[3];
            local_248[4] = (RTCHitN)auVar290[4];
            local_248[5] = (RTCHitN)auVar290[5];
            local_248[6] = (RTCHitN)auVar290[6];
            local_248[7] = (RTCHitN)auVar290[7];
            local_248[8] = (RTCHitN)auVar290[8];
            local_248[9] = (RTCHitN)auVar290[9];
            local_248[10] = (RTCHitN)auVar290[10];
            local_248[0xb] = (RTCHitN)auVar290[0xb];
            local_248[0xc] = (RTCHitN)auVar290[0xc];
            local_248[0xd] = (RTCHitN)auVar290[0xd];
            local_248[0xe] = (RTCHitN)auVar290[0xe];
            local_248[0xf] = (RTCHitN)auVar290[0xf];
            local_238 = auVar289;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            fStack_214 = local_218;
            fStack_210 = local_218;
            fStack_20c = local_218;
            local_208 = auVar116;
            local_1f8 = CONCAT44(uVar6,uVar6);
            uStack_1f0 = CONCAT44(uVar6,uVar6);
            local_1e8._4_4_ = uVar55;
            local_1e8._0_4_ = uVar55;
            local_1e8._8_4_ = uVar55;
            local_1e8._12_4_ = uVar55;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar123;
            local_488 = *local_478;
            args.valid = (int *)local_488;
            args.geometryUserPtr = pGVar7->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar7->intersectionFilterN)(&args);
              auVar121._8_56_ = extraout_var;
              auVar121._0_8_ = extraout_XMM1_Qa;
              auVar289 = auVar121._0_16_;
            }
            if (local_488 == (undefined1  [16])0x0) {
              auVar116 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar289 = vpcmpeqd_avx(auVar289,auVar289);
              auVar116 = auVar116 ^ auVar289;
            }
            else {
              p_Var13 = context->args->filter;
              auVar289 = vpcmpeqd_avx(auVar116,auVar116);
              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var13)(&args);
                auVar289 = vpcmpeqd_avx(auVar289,auVar289);
              }
              auVar290 = vpcmpeqd_avx(local_488,_DAT_01f45a50);
              auVar116 = auVar290 ^ auVar289;
              if (local_488 != (undefined1  [16])0x0) {
                auVar290 = auVar290 ^ auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar289;
                auVar289 = vmaskmovps_avx(auVar290,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar289;
              }
            }
            auVar86._8_8_ = 0x100000001;
            auVar86._0_8_ = 0x100000001;
            if ((auVar86 & auVar116) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar141;
            }
          }
        }
      }
    }
    goto LAB_0120e29c;
  }
  auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)fVar125),0x10);
  auVar74 = vinsertps_avx(auVar97,ZEXT416((uint)auVar98._0_4_),0x10);
  goto LAB_0120dce9;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }